

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType translate_one(CPUS390XState_conflict *env,DisasContext_conflict13 *s)

{
  DisasField DVar1;
  TCGContext_conflict12 *tcg_ctx;
  abi_ptr addr;
  TCGArg a1;
  uc_struct_conflict14 *val;
  void *pvVar2;
  hook *phVar3;
  TCGv_ptr pTVar4;
  uint32_t uVar5;
  uint uVar6;
  DisasJumpType DVar7;
  uintptr_t o_1;
  list_item *plVar8;
  TCGv_i64 pTVar9;
  TCGv_i64 pTVar10;
  TCGv_i32 pTVar11;
  DisasInsn *pDVar12;
  uint uVar13;
  byte bVar14;
  uintptr_t o_4;
  TCGTemp *ts;
  DisasJumpType DVar15;
  uintptr_t o_3;
  TCGTemp *ts_00;
  byte bVar16;
  uint uVar17;
  int iVar18;
  TCGArg a3;
  uintptr_t o_2;
  TCGTemp *ts_01;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  DisasOps o;
  TCGTemp *args [1];
  DisasOps local_a8;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_a8.in2 = (TCGv_i64)0x0;
  local_a8.addr1 = (TCGv_i64)0x0;
  local_a8.out2 = (TCGv_i64)0x0;
  local_a8.in1 = (TCGv_i64)0x0;
  local_a8.g_out = false;
  local_a8.g_out2 = false;
  local_a8.g_in1 = false;
  local_a8.g_in2 = false;
  local_a8._4_4_ = 0;
  local_a8.out = (TCGv_i64)0x0;
  if (s->ex_value == 0) {
    addr = (s->base).pc_next;
    uVar5 = cpu_lduw_code_s390x(env,addr);
    uVar19 = uVar5 >> 8 & 0xff;
    if ((uVar19 >> 6) - 1 < 2) {
      uVar5 = cpu_ldl_code_s390x(env,addr);
      uVar21 = (ulong)uVar5 << 0x20;
      uVar6 = 4;
    }
    else {
      uVar21 = (ulong)uVar5 << 0x30;
      if (uVar19 >> 6 == 0) {
        uVar6 = 2;
      }
      else {
        uVar5 = cpu_ldl_code_s390x(env,addr + 2);
        uVar21 = uVar21 | (ulong)uVar5 << 0x10;
        uVar6 = 6;
      }
    }
  }
  else {
    pTVar10 = tcg_const_i64_s390x(tcg_ctx,0);
    tcg_gen_op3_s390x(tcg_ctx,INDEX_op_st_i64,(TCGArg)(pTVar10 + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x338);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
    uVar22 = s->ex_value;
    uVar21 = uVar22 & 0xffffffffffff0000;
    uVar6 = (uint)uVar22 & 0xf;
    uVar19 = (uint)(byte)(uVar22 >> 0x38);
  }
  a1 = (s->base).pc_next;
  a3 = (TCGArg)uVar6;
  s->pc_tmp = a1 + a3;
  s->ilen = uVar6;
  if (uVar19 < 0x93) {
    if (((uVar19 != 1) && (uVar19 != 0x80)) && (uVar19 != 0x82)) goto switchD_00cba64a_caseD_94;
switchD_00cba64a_caseD_93:
    uVar6 = (uint)(byte)(uVar21 >> 0x30);
  }
  else {
    uVar6 = 0;
    switch(uVar19) {
    case 0x93:
    case 0xb2:
    case 0xb3:
    case 0xb9:
    case 0xe5:
      goto switchD_00cba64a_caseD_93;
    default:
switchD_00cba64a_caseD_94:
      uVar6 = (uint)(byte)(uVar21 >> 0x10);
      break;
    case 0xa5:
    case 0xa7:
    case 0xc0:
    case 0xc2:
    case 0xc4:
    case 0xc6:
    case 200:
    case 0xcc:
      uVar6 = (ushort)(uVar21 >> 0x30) & 0xf;
      break;
    case 0xc5:
    case 199:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xe1:
    case 0xe2:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xee:
    case 0xef:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
      break;
    }
  }
  *(undefined8 *)&(s->fields).field_0x8 = 0;
  (s->fields).c[0] = 0;
  (s->fields).c[1] = 0;
  (s->fields).c[2] = 0;
  (s->fields).c[3] = 0;
  (s->fields).c[4] = 0;
  (s->fields).c[5] = 0;
  *(undefined8 *)((s->fields).c + 6) = 0;
  (s->fields).raw_insn = uVar21;
  *(uint *)&(s->fields).field_0x8 = uVar6 << 8 | uVar19;
  uVar6 = uVar19 << 8 | uVar6;
  if (uVar6 < 0xc500) {
    if (uVar6 < 0xb2fa) {
      if (uVar6 < 0xa500) {
        if (uVar6 < 0x4e00) {
          if (uVar6 < 0x1900) {
            if (uVar6 < 0xe00) {
              if (uVar6 < 0x400) {
                switch(uVar6) {
                case 0x107:
                  pDVar12 = insn_info + 0x335;
                  break;
                default:
                  goto switchD_00cba6cf_caseD_b90e;
                case 0x10b:
                  pDVar12 = insn_info + 0x26e;
                  break;
                case 0x10c:
                  pDVar12 = insn_info + 0x206;
                  break;
                case 0x10d:
                  pDVar12 = insn_info + 0x207;
                  break;
                case 0x10e:
                  pDVar12 = insn_info + 0x208;
                }
              }
              else if (uVar6 < 0x700) {
                if (uVar6 == 0x400) {
                  pDVar12 = insn_info + 0x20e;
                }
                else if (uVar6 == 0x500) {
                  pDVar12 = insn_info + 0x42;
                }
                else {
                  if (uVar6 != 0x600) goto switchD_00cba6cf_caseD_b90e;
                  pDVar12 = insn_info + 0x4c;
                }
              }
              else if (uVar6 == 0x700) {
                pDVar12 = insn_info + 0x48;
              }
              else if (uVar6 == 0xa00) {
                pDVar12 = insn_info + 0x26d;
              }
              else {
                if (uVar6 != 0xd00) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x44;
              }
            }
            else if (uVar6 < 0x1300) {
              if (uVar6 < 0x1000) {
                if (uVar6 == 0xe00) {
                  pDVar12 = insn_info + 0x1b5;
                }
                else {
                  if (uVar6 != 0xf00) goto switchD_00cba6cf_caseD_b90e;
                  pDVar12 = insn_info + 0x9c;
                }
              }
              else if (uVar6 == 0x1000) {
                pDVar12 = insn_info + 0x189;
              }
              else if (uVar6 == 0x1100) {
                pDVar12 = insn_info + 0x176;
              }
              else {
                if (uVar6 != 0x1200) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x134;
              }
            }
            else if (uVar6 < 0x1600) {
              if (uVar6 == 0x1300) {
                pDVar12 = insn_info + 0x147;
              }
              else if (uVar6 == 0x1400) {
                pDVar12 = insn_info + 0x32;
              }
              else {
                if (uVar6 != 0x1500) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x84;
              }
            }
            else if (uVar6 == 0x1600) {
              pDVar12 = insn_info + 0x1e3;
            }
            else if (uVar6 == 0x1700) {
              pDVar12 = insn_info + 0xf3;
            }
            else {
              if (uVar6 != 0x1800) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x113;
            }
          }
          else if (uVar6 < 0x4200) {
            if (uVar6 < 0x1e00) {
              if (uVar6 < 0x1b00) {
                if (uVar6 == 0x1900) {
                  pDVar12 = insn_info + 0x60;
                }
                else {
                  if (uVar6 != 0x1a00) goto switchD_00cba6cf_caseD_b90e;
                  pDVar12 = insn_info;
                }
              }
              else if (uVar6 == 0x1b00) {
                pDVar12 = insn_info + 0x24a;
              }
              else if (uVar6 == 0x1c00) {
                pDVar12 = insn_info + 0x1be;
              }
              else {
                if (uVar6 != 0x1d00) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0xe4;
              }
            }
            else if (uVar6 < 0x3800) {
              if (uVar6 == 0x1e00) {
                pDVar12 = insn_info + 0x1b;
              }
              else if (uVar6 == 0x1f00) {
                pDVar12 = insn_info + 0x25c;
              }
              else {
                if (uVar6 != 0x2800) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x11a;
              }
            }
            else if (uVar6 == 0x3800) {
              pDVar12 = insn_info + 0x11d;
            }
            else if (uVar6 == 0x4000) {
              pDVar12 = insn_info + 0x233;
            }
            else {
              if (uVar6 != 0x4100) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x125;
            }
          }
          else if (uVar6 < 0x4800) {
            if (uVar6 < 0x4500) {
              if (uVar6 == 0x4200) {
                pDVar12 = insn_info + 0x22d;
              }
              else if (uVar6 == 0x4300) {
                pDVar12 = insn_info + 0x107;
              }
              else {
                if (uVar6 != 0x4400) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0xff;
              }
            }
            else if (uVar6 == 0x4500) {
              pDVar12 = insn_info + 0x43;
            }
            else if (uVar6 == 0x4600) {
              pDVar12 = insn_info + 0x4e;
            }
            else {
              if (uVar6 != 0x4700) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x49;
            }
          }
          else if (uVar6 < 0x4b00) {
            if (uVar6 == 0x4800) {
              pDVar12 = insn_info + 0x151;
            }
            else if (uVar6 == 0x4900) {
              pDVar12 = insn_info + 0x76;
            }
            else {
              if (uVar6 != 0x4a00) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x17;
            }
          }
          else if (uVar6 == 0x4b00) {
            pDVar12 = insn_info + 600;
          }
          else if (uVar6 == 0x4c00) {
            pDVar12 = insn_info + 0x1ca;
          }
          else {
            if (uVar6 != 0x4d00) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x45;
          }
        }
        else if (uVar6 < 0x8400) {
          if (uVar6 < 0x5c00) {
            if (uVar6 < 0x5600) {
              if (uVar6 < 0x5100) {
                if (uVar6 == 0x4e00) {
                  pDVar12 = insn_info + 0xc4;
                }
                else {
                  if (uVar6 != 0x5000) goto switchD_00cba6cf_caseD_b90e;
                  pDVar12 = insn_info + 0x224;
                }
              }
              else if (uVar6 == 0x5100) {
                pDVar12 = insn_info + 0x127;
              }
              else if (uVar6 == 0x5400) {
                pDVar12 = insn_info + 0x34;
              }
              else {
                if (uVar6 != 0x5500) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x85;
              }
            }
            else if (uVar6 < 0x5900) {
              if (uVar6 == 0x5600) {
                pDVar12 = insn_info + 0x1e5;
              }
              else if (uVar6 == 0x5700) {
                pDVar12 = insn_info + 0xf5;
              }
              else {
                if (uVar6 != 0x5800) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x114;
              }
            }
            else if (uVar6 == 0x5900) {
              pDVar12 = insn_info + 0x61;
            }
            else if (uVar6 == 0x5a00) {
              pDVar12 = insn_info + 2;
            }
            else {
              if (uVar6 != 0x5b00) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x24c;
            }
          }
          else if (uVar6 < 0x7000) {
            if (uVar6 < 0x5f00) {
              if (uVar6 == 0x5c00) {
                pDVar12 = insn_info + 0x1bf;
              }
              else if (uVar6 == 0x5d00) {
                pDVar12 = insn_info + 0xe5;
              }
              else {
                if (uVar6 != 0x5e00) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x1d;
              }
            }
            else if (uVar6 == 0x5f00) {
              pDVar12 = insn_info + 0x25e;
            }
            else if (uVar6 == 0x6000) {
              pDVar12 = insn_info + 0x227;
            }
            else {
              if (uVar6 != 0x6800) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x11b;
            }
          }
          else if (uVar6 < 0x8000) {
            if (uVar6 == 0x7000) {
              pDVar12 = insn_info + 0x229;
            }
            else if (uVar6 == 0x7100) {
              pDVar12 = insn_info + 0x1d3;
            }
            else {
              if (uVar6 != 0x7800) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x11e;
            }
          }
          else if (uVar6 == 0x8000) {
            pDVar12 = insn_info + 0x33a;
          }
          else if (uVar6 == 0x8200) {
            pDVar12 = insn_info + 0x326;
          }
          else {
            if (uVar6 != 0x8300) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 799;
          }
        }
        else if (uVar6 < 0x8f00) {
          if (uVar6 < 0x8900) {
            if (uVar6 < 0x8600) {
              if (uVar6 == 0x8400) {
                pDVar12 = insn_info + 0x57;
              }
              else {
                if (uVar6 != 0x8500) goto switchD_00cba6cf_caseD_b90e;
                pDVar12 = insn_info + 0x58;
              }
            }
            else if (uVar6 == 0x8600) {
              pDVar12 = insn_info + 0x53;
            }
            else if (uVar6 == 0x8700) {
              pDVar12 = insn_info + 0x54;
            }
            else {
              if (uVar6 != 0x8800) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x218;
            }
          }
          else if (uVar6 < 0x8c00) {
            if (uVar6 == 0x8900) {
              pDVar12 = insn_info + 0x212;
            }
            else if (uVar6 == 0x8a00) {
              pDVar12 = insn_info + 0x215;
            }
            else {
              if (uVar6 != 0x8b00) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x20f;
            }
          }
          else if (uVar6 == 0x8c00) {
            pDVar12 = insn_info + 0x21e;
          }
          else if (uVar6 == 0x8d00) {
            pDVar12 = insn_info + 0x21c;
          }
          else {
            if (uVar6 != 0x8e00) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x21d;
          }
        }
        else if (uVar6 < 0x9500) {
          if (uVar6 < 0x9200) {
            if (uVar6 == 0x8f00) {
              pDVar12 = insn_info + 0x21b;
            }
            else if (uVar6 == 0x9000) {
              pDVar12 = insn_info + 0x243;
            }
            else {
              if (uVar6 != 0x9100) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x274;
            }
          }
          else if (uVar6 == 0x9200) {
            pDVar12 = insn_info + 0x1b2;
          }
          else if (uVar6 == 0x9300) {
            pDVar12 = insn_info + 0x26f;
          }
          else {
            if (uVar6 != 0x9400) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x40;
          }
        }
        else if (uVar6 < 0x9800) {
          if (uVar6 == 0x9500) {
            pDVar12 = insn_info + 0x91;
          }
          else if (uVar6 == 0x9600) {
            pDVar12 = insn_info + 0x1f1;
          }
          else {
            if (uVar6 != 0x9700) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0xfd;
          }
        }
        else if (uVar6 == 0x9800) {
          pDVar12 = insn_info + 0x1a8;
        }
        else if (uVar6 == 0x9a00) {
          pDVar12 = insn_info + 0x1ac;
        }
        else {
          if (uVar6 != 0x9b00) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x247;
        }
      }
      else if (uVar6 < 0xb202) {
        if (uVar6 < 0xa700) {
          switch(uVar6) {
          case 0xa500:
            pDVar12 = insn_info + 0x10e;
            break;
          case 0xa501:
            pDVar12 = insn_info + 0x10f;
            break;
          case 0xa502:
            pDVar12 = insn_info + 0x110;
            break;
          case 0xa503:
            pDVar12 = insn_info + 0x111;
            break;
          case 0xa504:
            pDVar12 = insn_info + 0x3c;
            break;
          case 0xa505:
            pDVar12 = insn_info + 0x3d;
            break;
          case 0xa506:
            pDVar12 = insn_info + 0x3e;
            break;
          case 0xa507:
            pDVar12 = insn_info + 0x3f;
            break;
          case 0xa508:
            pDVar12 = insn_info + 0x1ed;
            break;
          case 0xa509:
            pDVar12 = insn_info + 0x1ee;
            break;
          case 0xa50a:
            pDVar12 = insn_info + 0x1ef;
            break;
          case 0xa50b:
            pDVar12 = insn_info + 0x1f0;
            break;
          case 0xa50c:
            pDVar12 = insn_info + 0x16d;
            break;
          case 0xa50d:
            pDVar12 = insn_info + 0x16e;
            break;
          case 0xa50e:
            pDVar12 = insn_info + 0x16f;
            break;
          case 0xa50f:
            pDVar12 = insn_info + 0x170;
            break;
          default:
            goto switchD_00cba6cf_caseD_b90e;
          }
        }
        else if (uVar6 < 0xa800) {
          switch(uVar6) {
          case 0xa700:
            pDVar12 = insn_info + 0x278;
            break;
          case 0xa701:
            pDVar12 = insn_info + 0x279;
            break;
          case 0xa702:
            pDVar12 = insn_info + 0x276;
            break;
          case 0xa703:
            pDVar12 = insn_info + 0x277;
            break;
          case 0xa704:
            pDVar12 = insn_info + 0x4a;
            break;
          case 0xa705:
            pDVar12 = insn_info + 0x46;
            break;
          case 0xa706:
            pDVar12 = insn_info + 0x50;
            break;
          case 0xa707:
            pDVar12 = insn_info + 0x51;
            break;
          case 0xa708:
            pDVar12 = insn_info + 0x155;
            break;
          case 0xa709:
            pDVar12 = insn_info + 0x156;
            break;
          case 0xa70a:
            pDVar12 = insn_info + 0x19;
            break;
          case 0xa70b:
            pDVar12 = insn_info + 0x1a;
            break;
          case 0xa70c:
            pDVar12 = insn_info + 0x1cc;
            break;
          case 0xa70d:
            pDVar12 = insn_info + 0x1cd;
            break;
          case 0xa70e:
            pDVar12 = insn_info + 0x79;
            break;
          case 0xa70f:
            pDVar12 = insn_info + 0x7a;
            break;
          default:
            goto switchD_00cba6cf_caseD_b90e;
          }
        }
        else if (uVar6 < 0xad00) {
          if (uVar6 == 0xa800) {
            pDVar12 = insn_info + 0x1b6;
          }
          else if (uVar6 == 0xa900) {
            pDVar12 = insn_info + 0x9d;
          }
          else {
            if (uVar6 != 0xac00) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x345;
          }
        }
        else if (uVar6 == 0xad00) {
          pDVar12 = insn_info + 0x346;
        }
        else if (uVar6 == 0xae00) {
          pDVar12 = insn_info + 0x33b;
        }
        else {
          if (uVar6 != 0xb100) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x328;
        }
      }
      else if (uVar6 < 0xb299) {
        switch(uVar6) {
        case 0xb202:
          pDVar12 = insn_info + 0x340;
          break;
        default:
          goto switchD_00cba6cf_caseD_b90e;
        case 0xb204:
          pDVar12 = insn_info + 0x333;
          break;
        case 0xb205:
          pDVar12 = insn_info + 0x23e;
          break;
        case 0xb206:
          pDVar12 = insn_info + 0x334;
          break;
        case 0xb207:
          pDVar12 = insn_info + 0x33c;
          break;
        case 0xb208:
          pDVar12 = insn_info + 0x336;
          break;
        case 0xb209:
          pDVar12 = insn_info + 0x341;
          break;
        case 0xb20a:
          pDVar12 = insn_info + 0x338;
          break;
        case 0xb20d:
          pDVar12 = insn_info + 0x32f;
          break;
        case 0xb210:
          pDVar12 = insn_info + 0x337;
          break;
        case 0xb211:
          pDVar12 = insn_info + 0x343;
          break;
        case 0xb212:
          pDVar12 = insn_info + 0x33f;
          break;
        case 0xb220:
          pDVar12 = insn_info + 0x331;
          break;
        case 0xb221:
          pDVar12 = insn_info + 0x322;
          break;
        case 0xb222:
          pDVar12 = insn_info + 0x112;
          break;
        case 0xb229:
          pDVar12 = insn_info + 800;
          break;
        case 0xb22a:
          pDVar12 = insn_info + 0x330;
          break;
        case 0xb22b:
          pDVar12 = insn_info + 0x339;
          break;
        case 0xb22c:
          pDVar12 = insn_info + 0x349;
          break;
        case 0xb230:
          pDVar12 = insn_info + 0x34c;
          break;
        case 0xb231:
          pDVar12 = insn_info + 0x34d;
          break;
        case 0xb232:
          pDVar12 = insn_info + 0x34e;
          break;
        case 0xb233:
          pDVar12 = insn_info + 0x355;
          break;
        case 0xb234:
          pDVar12 = insn_info + 0x357;
          break;
        case 0xb235:
          pDVar12 = insn_info + 0x359;
          break;
        case 0xb236:
          pDVar12 = insn_info + 0x358;
          break;
        case 0xb237:
          pDVar12 = insn_info + 0x351;
          break;
        case 0xb238:
          pDVar12 = insn_info + 0x350;
          break;
        case 0xb239:
          pDVar12 = insn_info + 0x356;
          break;
        case 0xb23a:
          pDVar12 = insn_info + 0x354;
          break;
        case 0xb23b:
          pDVar12 = insn_info + 0x34f;
          break;
        case 0xb23c:
          pDVar12 = insn_info + 0x352;
          break;
        case 0xb241:
          pDVar12 = insn_info + 0x5e;
          break;
        case 0xb246:
          pDVar12 = insn_info + 0x347;
          break;
        case 0xb24b:
          pDVar12 = insn_info + 0x32b;
          break;
        case 0xb24e:
          pDVar12 = insn_info + 0x205;
          break;
        case 0xb24f:
          pDVar12 = insn_info + 0x101;
          break;
        case 0xb250:
          pDVar12 = insn_info + 0x31d;
          break;
        case 0xb252:
          pDVar12 = insn_info + 0x1d2;
          break;
        case 0xb254:
          pDVar12 = insn_info + 0x1b9;
          break;
        case 0xb255:
          pDVar12 = insn_info + 0x1ba;
          break;
        case 0xb25d:
          pDVar12 = insn_info + 0xa2;
          break;
        case 0xb25e:
          pDVar12 = insn_info + 0x203;
          break;
        case 0xb25f:
          pDVar12 = insn_info + 0x35a;
          break;
        case 0xb274:
          pDVar12 = insn_info + 0x353;
          break;
        case 0xb276:
          pDVar12 = insn_info + 0x34b;
          break;
        case 0xb278:
          pDVar12 = insn_info + 0x240;
          break;
        case 0xb279:
          pDVar12 = insn_info + 0x332;
          break;
        case 0xb27c:
          pDVar12 = insn_info + 0x23f;
          break;
        case 0xb27d:
          pDVar12 = insn_info + 0x344;
          break;
        case 0xb280:
          pDVar12 = insn_info + 0x325;
        }
      }
      else {
        switch(uVar6) {
        case 0xb299:
          pDVar12 = insn_info + 0x20b;
          break;
        case 0xb29a:
        case 0xb29b:
        case 0xb29e:
        case 0xb29f:
        case 0xb2a0:
        case 0xb2a1:
        case 0xb2a2:
        case 0xb2a3:
        case 0xb2a4:
          goto switchD_00cba6cf_caseD_b90e;
        case 0xb29c:
          pDVar12 = insn_info + 0x242;
          break;
        case 0xb29d:
          pDVar12 = insn_info + 0x198;
          break;
        case 0xb2a5:
          pDVar12 = insn_info + 0x27d;
          break;
        case 0xb2a6:
          pDVar12 = insn_info + 0xe0;
          break;
        case 0xb2a7:
          pDVar12 = insn_info + 0xde;
          break;
        default:
          switch(uVar6) {
          case 0xb2b0:
            pDVar12 = insn_info + 0x241;
            break;
          case 0xb2b1:
            pDVar12 = insn_info + 0x342;
            break;
          case 0xb2b2:
            pDVar12 = insn_info + 0x327;
            break;
          case 0xb2b3:
          case 0xb2b4:
          case 0xb2b5:
          case 0xb2b6:
          case 0xb2b7:
          case 0xb2ba:
          case 0xb2bb:
          case 0xb2bc:
            goto switchD_00cba6cf_caseD_b90e;
          case 0xb2b8:
            pDVar12 = insn_info + 0x20c;
            break;
          case 0xb2b9:
            pDVar12 = insn_info + 0x20d;
            break;
          case 0xb2bd:
            pDVar12 = insn_info + 0x199;
            break;
          default:
            if (uVar6 != 0xb2e8) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x1f8;
          }
        }
      }
    }
    else if (uVar6 < 0xb900) {
      switch(uVar6) {
      case 0xb2fa:
        pDVar12 = insn_info + 0x5d;
        break;
      case 0xb2fb:
      case 0xb2fc:
      case 0xb2fd:
      case 0xb2fe:
      case 0xb2ff:
      case 0xb320:
      case 0xb321:
      case 0xb322:
      case 0xb323:
      case 0xb325:
      case 0xb326:
      case 0xb327:
      case 0xb328:
      case 0xb329:
      case 0xb32a:
      case 0xb32b:
      case 0xb32c:
      case 0xb32d:
      case 0xb32e:
      case 0xb32f:
      case 0xb330:
      case 0xb331:
      case 0xb332:
      case 0xb333:
      case 0xb334:
      case 0xb335:
      case 0xb336:
      case 0xb337:
      case 0xb338:
      case 0xb339:
      case 0xb33a:
      case 0xb33b:
      case 0xb33c:
      case 0xb33d:
      case 0xb33e:
      case 0xb33f:
      case 0xb34e:
      case 0xb34f:
      case 0xb350:
      case 0xb351:
      case 0xb352:
      case 0xb353:
      case 0xb354:
      case 0xb355:
      case 0xb356:
      case 0xb358:
      case 0xb359:
      case 0xb35a:
      case 0xb35b:
      case 0xb35c:
      case 0xb35d:
      case 0xb35e:
      case 0xb360:
      case 0xb361:
      case 0xb362:
      case 0xb363:
      case 0xb364:
      case 0xb366:
      case 0xb367:
      case 0xb368:
      case 0xb369:
      case 0xb36a:
      case 0xb36b:
      case 0xb36c:
      case 0xb36d:
      case 0xb36e:
      case 0xb36f:
      case 0xb377:
      case 0xb378:
      case 0xb379:
      case 0xb37a:
      case 0xb37b:
      case 0xb37c:
      case 0xb37d:
      case 0xb37e:
      case 0xb37f:
      case 0xb380:
      case 0xb381:
      case 0xb382:
      case 0xb383:
      case 0xb386:
      case 0xb387:
      case 0xb388:
      case 0xb389:
      case 0xb38a:
      case 0xb38b:
      case 0xb38d:
      case 0xb38e:
      case 0xb38f:
      case 0xb393:
      case 0xb397:
      case 0xb39b:
      case 0xb39f:
      case 0xb3a3:
      case 0xb3a7:
      case 0xb3ab:
      case 45999:
      case 46000:
      case 0xb3b1:
      case 0xb3b2:
      case 0xb3b3:
      case 0xb3b4:
      case 0xb3b5:
      case 0xb3b6:
      case 0xb3b7:
      case 0xb3b8:
      case 0xb3b9:
      case 0xb3ba:
      case 0xb3bb:
      case 0xb3bc:
      case 0xb3bd:
      case 0xb3be:
      case 0xb3bf:
      case 0xb3c0:
      case 0xb3c2:
      case 0xb3c3:
      case 0xb3c4:
      case 0xb3c5:
      case 0xb3c6:
      case 0xb3c7:
      case 0xb3c8:
      case 0xb3c9:
      case 0xb3ca:
      case 0xb3cb:
      case 0xb3cc:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xb300:
        pDVar12 = insn_info + 0x18c;
        break;
      case 0xb301:
        pDVar12 = insn_info + 0x179;
        break;
      case 0xb302:
        pDVar12 = insn_info + 0x13a;
        break;
      case 0xb303:
        pDVar12 = insn_info + 0x14a;
        break;
      case 0xb304:
        pDVar12 = insn_info + 0x19d;
        break;
      case 0xb305:
        pDVar12 = insn_info + 0x19e;
        break;
      case 0xb306:
        pDVar12 = insn_info + 0x19f;
        break;
      case 0xb307:
        pDVar12 = insn_info + 0x1c5;
        break;
      case 0xb308:
        pDVar12 = insn_info + 0x6c;
        break;
      case 0xb309:
        pDVar12 = insn_info + 0x67;
        break;
      case 0xb30a:
        pDVar12 = insn_info + 9;
        break;
      case 0xb30b:
        pDVar12 = insn_info + 0x253;
        break;
      case 0xb30c:
        pDVar12 = insn_info + 0x1c4;
        break;
      case 0xb30d:
        pDVar12 = insn_info + 0xe6;
        break;
      case 0xb30e:
        pDVar12 = insn_info + 0x1db;
        break;
      case 0xb30f:
        pDVar12 = insn_info + 0x1df;
        break;
      case 0xb310:
        pDVar12 = insn_info + 0x18d;
        break;
      case 0xb311:
        pDVar12 = insn_info + 0x17a;
        break;
      case 0xb312:
        pDVar12 = insn_info + 0x13b;
        break;
      case 0xb313:
        pDVar12 = insn_info + 0x14b;
        break;
      case 0xb314:
        pDVar12 = insn_info + 0x21f;
        break;
      case 0xb315:
        pDVar12 = insn_info + 0x220;
        break;
      case 0xb316:
        pDVar12 = insn_info + 0x221;
        break;
      case 0xb317:
        pDVar12 = insn_info + 0x1c1;
        break;
      case 0xb318:
        pDVar12 = insn_info + 0x6d;
        break;
      case 0xb319:
        pDVar12 = insn_info + 0x68;
        break;
      case 0xb31a:
        pDVar12 = insn_info + 10;
        break;
      case 0xb31b:
        pDVar12 = insn_info + 0x254;
        break;
      case 0xb31c:
        pDVar12 = insn_info + 0x1c2;
        break;
      case 0xb31d:
        pDVar12 = insn_info + 0xe7;
        break;
      case 0xb31e:
        pDVar12 = insn_info + 0x1dc;
        break;
      case 0xb31f:
        pDVar12 = insn_info + 0x1e0;
        break;
      case 0xb324:
        pDVar12 = insn_info + 0x1a3;
        break;
      case 0xb340:
        pDVar12 = insn_info + 0x18e;
        break;
      case 0xb341:
        pDVar12 = insn_info + 0x17b;
        break;
      case 0xb342:
        pDVar12 = insn_info + 0x13c;
        break;
      case 0xb343:
        pDVar12 = insn_info + 0x14c;
        break;
      case 0xb344:
        pDVar12 = insn_info + 0x1a5;
        break;
      case 0xb345:
        pDVar12 = insn_info + 0x1a6;
        break;
      case 0xb346:
        pDVar12 = insn_info + 0x1a7;
        break;
      case 0xb347:
        pDVar12 = insn_info + 0x19c;
        break;
      case 0xb348:
        pDVar12 = insn_info + 0x6e;
        break;
      case 0xb349:
        pDVar12 = insn_info + 0x69;
        break;
      case 0xb34a:
        pDVar12 = insn_info + 0xb;
        break;
      case 0xb34b:
        pDVar12 = insn_info + 0x255;
        break;
      case 0xb34c:
        pDVar12 = insn_info + 0x1c3;
        break;
      case 0xb34d:
        pDVar12 = insn_info + 0xe8;
        break;
      case 0xb357:
        pDVar12 = insn_info + 0x19a;
        break;
      case 0xb35f:
        pDVar12 = insn_info + 0x19b;
        break;
      case 0xb365:
        pDVar12 = insn_info + 0x120;
        break;
      case 0xb370:
        pDVar12 = insn_info + 399;
        break;
      case 0xb371:
        pDVar12 = insn_info + 0x17c;
        break;
      case 0xb372:
        pDVar12 = insn_info + 0x5f;
        break;
      case 0xb373:
        pDVar12 = insn_info + 0x14d;
        break;
      case 0xb374:
        pDVar12 = insn_info + 0x195;
        break;
      case 0xb375:
        pDVar12 = insn_info + 0x196;
        break;
      case 0xb376:
        pDVar12 = insn_info + 0x197;
        break;
      case 0xb384:
        pDVar12 = insn_info + 0x209;
        break;
      case 0xb385:
        pDVar12 = insn_info + 0x20a;
        break;
      case 0xb38c:
        pDVar12 = insn_info + 0x104;
        break;
      case 0xb390:
        pDVar12 = insn_info + 0xd8;
        break;
      case 0xb391:
        pDVar12 = insn_info + 0xd9;
        break;
      case 0xb392:
        pDVar12 = insn_info + 0xda;
        break;
      case 0xb394:
        pDVar12 = insn_info + 0xcc;
        break;
      case 0xb395:
        pDVar12 = insn_info + 0xcd;
        break;
      case 0xb396:
        pDVar12 = insn_info + 0xce;
        break;
      case 0xb398:
        pDVar12 = insn_info + 0xc6;
        break;
      case 0xb399:
        pDVar12 = insn_info + 199;
        break;
      case 0xb39a:
        pDVar12 = insn_info + 200;
        break;
      case 0xb39c:
        pDVar12 = insn_info + 0xd2;
        break;
      case 0xb39d:
        pDVar12 = insn_info + 0xd3;
        break;
      case 0xb39e:
        pDVar12 = insn_info + 0xd4;
        break;
      case 0xb3a0:
        pDVar12 = insn_info + 0xdb;
        break;
      case 0xb3a1:
        pDVar12 = insn_info + 0xdc;
        break;
      case 0xb3a2:
        pDVar12 = insn_info + 0xdd;
        break;
      case 0xb3a4:
        pDVar12 = insn_info + 0xcf;
        break;
      case 0xb3a5:
        pDVar12 = insn_info + 0xd0;
        break;
      case 0xb3a6:
        pDVar12 = insn_info + 0xd1;
        break;
      case 0xb3a8:
        pDVar12 = insn_info + 0xc9;
        break;
      case 0xb3a9:
        pDVar12 = insn_info + 0xca;
        break;
      case 0xb3aa:
        pDVar12 = insn_info + 0xcb;
        break;
      case 0xb3ac:
        pDVar12 = insn_info + 0xd5;
        break;
      case 0xb3ad:
        pDVar12 = insn_info + 0xd6;
        break;
      case 0xb3ae:
        pDVar12 = insn_info + 0xd7;
        break;
      case 0xb3c1:
        pDVar12 = insn_info + 0x174;
        break;
      case 0xb3cd:
        pDVar12 = insn_info + 0x175;
        break;
      default:
        if (uVar6 == 0xb600) {
          pDVar12 = insn_info + 0x33d;
        }
        else {
          if (uVar6 != 0xb700) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x323;
        }
      }
    }
    else if (uVar6 < 0xbe00) {
      switch(uVar6) {
      case 0xb900:
        pDVar12 = insn_info + 0x18a;
        break;
      case 0xb901:
        pDVar12 = insn_info + 0x177;
        break;
      case 0xb902:
        pDVar12 = insn_info + 0x135;
        break;
      case 0xb903:
        pDVar12 = insn_info + 0x148;
        break;
      case 0xb904:
        pDVar12 = insn_info + 0x116;
        break;
      case 0xb905:
        pDVar12 = insn_info + 0x32c;
        break;
      case 0xb906:
        pDVar12 = insn_info + 0x143;
        break;
      case 0xb907:
        pDVar12 = insn_info + 0x150;
        break;
      case 0xb908:
        pDVar12 = insn_info + 4;
        break;
      case 0xb909:
        pDVar12 = insn_info + 0x24e;
        break;
      case 0xb90a:
        pDVar12 = insn_info + 0x1f;
        break;
      case 0xb90b:
        pDVar12 = insn_info + 0x260;
        break;
      case 0xb90c:
        pDVar12 = insn_info + 0x1d5;
        break;
      case 0xb90d:
        pDVar12 = insn_info + 0xef;
        break;
      case 0xb90e:
      case 0xb915:
      case 0xb922:
      case 0xb923:
      case 0xb924:
      case 0xb929:
      case 0xb932:
      case 0xb933:
      case 0xb934:
      case 0xb935:
      case 0xb936:
      case 0xb937:
      case 0xb938:
      case 0xb939:
      case 0xb93a:
      case 0xb93b:
      case 0xb93d:
      case 0xb940:
      case 0xb941:
      case 0xb942:
      case 0xb943:
      case 0xb944:
      case 0xb945:
      case 0xb947:
      case 0xb948:
      case 0xb949:
      case 0xb94a:
      case 0xb94b:
      case 0xb94c:
      case 0xb94d:
      case 0xb94e:
      case 0xb94f:
      case 0xb950:
      case 0xb951:
      case 0xb952:
      case 0xb953:
      case 0xb954:
      case 0xb955:
      case 0xb956:
      case 0xb957:
      case 0xb958:
      case 0xb959:
      case 0xb95a:
      case 0xb95b:
      case 0xb95c:
      case 0xb95d:
      case 0xb95e:
      case 0xb95f:
      case 0xb962:
      case 0xb963:
      case 0xb964:
      case 0xb965:
      case 0xb966:
      case 0xb967:
      case 0xb968:
      case 0xb969:
      case 0xb96a:
      case 0xb96b:
      case 0xb96c:
      case 0xb96d:
      case 0xb96e:
      case 0xb96f:
      case 0xb970:
      case 0xb971:
      case 0xb974:
      case 0xb975:
      case 0xb976:
      case 0xb977:
      case 0xb978:
      case 0xb979:
      case 0xb97a:
      case 0xb97b:
      case 0xb97c:
      case 0xb97d:
      case 0xb97e:
      case 0xb97f:
      case 0xb98b:
      case 0xb98c:
      case 0xb98f:
      case 0xb99a:
      case 0xb99b:
      case 0xb99c:
      case 0xb99d:
      case 0xb99e:
      case 0xb99f:
      case 0xb9a1:
      case 0xb9a2:
      case 0xb9a3:
      case 0xb9a4:
      case 0xb9a5:
      case 0xb9a6:
      case 0xb9a7:
      case 0xb9a8:
      case 0xb9a9:
      case 0xb9aa:
      case 0xb9ab:
      case 0xb9ac:
      case 0xb9ad:
      case 0xb9ae:
      case 0xb9af:
      case 0xb9b4:
      case 0xb9b5:
      case 0xb9b6:
      case 0xb9b7:
      case 0xb9b8:
      case 0xb9b9:
      case 0xb9ba:
      case 0xb9bb:
      case 0xb9bc:
      case 0xb9bd:
      case 0xb9bf:
      case 0xb9c0:
      case 0xb9c1:
      case 0xb9c2:
      case 0xb9c3:
      case 0xb9c4:
      case 0xb9c5:
      case 0xb9c6:
      case 0xb9c7:
      case 0xb9cc:
      case 0xb9ce:
      case 0xb9d1:
      case 0xb9d4:
      case 0xb9d5:
      case 0xb9d6:
      case 0xb9d7:
      case 0xb9dc:
      case 0xb9de:
      case 0xb9e3:
      case 0xb9e5:
      case 0xb9ec:
      case 0xb9ed:
      case 0xb9ee:
      case 0xb9ef:
      case 0xb9f0:
      case 0xb9f1:
      case 0xb9f3:
      case 0xb9f5:
      case 0xb9fc:
      case 0xb9fd:
      case 0xb9fe:
      case 0xb9ff:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xb90f:
        pDVar12 = insn_info + 0x191;
        break;
      case 0xb910:
        pDVar12 = insn_info + 0x18b;
        break;
      case 0xb911:
        pDVar12 = insn_info + 0x178;
        break;
      case 0xb912:
        pDVar12 = insn_info + 0x136;
        break;
      case 0xb913:
        pDVar12 = insn_info + 0x149;
        break;
      case 0xb914:
        pDVar12 = insn_info + 0x117;
        break;
      case 0xb916:
        pDVar12 = insn_info + 0x15b;
        break;
      case 0xb917:
        pDVar12 = insn_info + 0x171;
        break;
      case 0xb918:
        pDVar12 = insn_info + 5;
        break;
      case 0xb919:
        pDVar12 = insn_info + 0x24f;
        break;
      case 0xb91a:
        pDVar12 = insn_info + 0x20;
        break;
      case 0xb91b:
        pDVar12 = insn_info + 0x261;
        break;
      case 0xb91c:
        pDVar12 = insn_info + 0x1d6;
        break;
      case 0xb91d:
        pDVar12 = insn_info + 0xf0;
        break;
      case 0xb91e:
        pDVar12 = insn_info + 0x285;
        break;
      case 0xb91f:
        pDVar12 = insn_info + 400;
        break;
      case 0xb920:
        pDVar12 = insn_info + 99;
        break;
      case 0xb921:
        pDVar12 = insn_info + 0x87;
        break;
      case 0xb925:
        pDVar12 = insn_info + 0x348;
        break;
      case 0xb926:
        pDVar12 = insn_info + 0x142;
        break;
      case 0xb927:
        pDVar12 = insn_info + 0x14f;
        break;
      case 0xb928:
        pDVar12 = insn_info + 0x286;
        break;
      case 0xb92a:
        pDVar12 = insn_info + 0x287;
        break;
      case 0xb92b:
        pDVar12 = insn_info + 0x288;
        break;
      case 0xb92c:
        pDVar12 = insn_info + 0x289;
        break;
      case 0xb92d:
        pDVar12 = insn_info + 0x28a;
        break;
      case 0xb92e:
        pDVar12 = insn_info + 0x28b;
        break;
      case 0xb92f:
        pDVar12 = insn_info + 0x28c;
        break;
      case 0xb930:
        pDVar12 = insn_info + 100;
        break;
      case 0xb931:
        pDVar12 = insn_info + 0x88;
        break;
      case 0xb93c:
        pDVar12 = insn_info + 0x28d;
        break;
      case 0xb93e:
        pDVar12 = insn_info + 0x28e;
        break;
      case 0xb93f:
        pDVar12 = insn_info + 0x28f;
        break;
      case 0xb946:
        pDVar12 = insn_info + 0x4d;
        break;
      case 0xb960:
        pDVar12 = insn_info + 0xbb;
        break;
      case 0xb961:
        pDVar12 = insn_info + 0xbf;
        break;
      case 0xb972:
        pDVar12 = insn_info + 0xba;
        break;
      case 0xb973:
        pDVar12 = insn_info + 0xbe;
        break;
      case 0xb980:
        pDVar12 = insn_info + 0x36;
        break;
      case 0xb981:
        pDVar12 = insn_info + 0x1e7;
        break;
      case 0xb982:
        pDVar12 = insn_info + 0xf7;
        break;
      case 0xb983:
        pDVar12 = insn_info + 0x106;
        break;
      case 0xb984:
        pDVar12 = insn_info + 0x160;
        break;
      case 0xb985:
        pDVar12 = insn_info + 0x165;
        break;
      case 0xb986:
        pDVar12 = insn_info + 0x1d0;
        break;
      case 0xb987:
        pDVar12 = insn_info + 0xed;
        break;
      case 0xb988:
        pDVar12 = insn_info + 0x2f;
        break;
      case 0xb989:
        pDVar12 = insn_info + 0x26a;
        break;
      case 0xb98a:
        pDVar12 = insn_info + 0x31e;
        break;
      case 0xb98d:
        pDVar12 = insn_info + 0x105;
        break;
      case 0xb98e:
        pDVar12 = insn_info + 0x321;
        break;
      case 0xb990:
        pDVar12 = insn_info + 0x281;
        break;
      case 0xb991:
        pDVar12 = insn_info + 0x280;
        break;
      case 0xb992:
        pDVar12 = insn_info + 0x27f;
        break;
      case 0xb993:
        pDVar12 = insn_info + 0x27e;
        break;
      case 0xb994:
        pDVar12 = insn_info + 0x15f;
        break;
      case 0xb995:
        pDVar12 = insn_info + 0x164;
        break;
      case 0xb996:
        pDVar12 = insn_info + 0x1ce;
        break;
      case 0xb997:
        pDVar12 = insn_info + 0xeb;
        break;
      case 0xb998:
        pDVar12 = insn_info + 0x2e;
        break;
      case 0xb999:
        pDVar12 = insn_info + 0x269;
        break;
      case 0xb9a0:
        pDVar12 = insn_info + 0x35d;
        break;
      case 0xb9b0:
        pDVar12 = insn_info + 0xdf;
        break;
      case 0xb9b1:
        pDVar12 = insn_info + 0xe1;
        break;
      case 0xb9b2:
        pDVar12 = insn_info + 0xe2;
        break;
      case 0xb9b3:
        pDVar12 = insn_info + 0xe3;
        break;
      case 0xb9be:
        pDVar12 = insn_info + 0x204;
        break;
      case 0xb9c8:
        pDVar12 = insn_info + 0xe;
        break;
      case 0xb9c9:
        pDVar12 = insn_info + 0x25a;
        break;
      case 0xb9ca:
        pDVar12 = insn_info + 0x24;
        break;
      case 0xb9cb:
        pDVar12 = insn_info + 0x265;
        break;
      case 0xb9cd:
        pDVar12 = insn_info + 0x80;
        break;
      case 0xb9cf:
        pDVar12 = insn_info + 0x8c;
        break;
      case 0xb9d0:
        pDVar12 = insn_info + 0x35e;
        break;
      case 0xb9d2:
        pDVar12 = insn_info + 0x35f;
        break;
      case 0xb9d3:
        pDVar12 = insn_info + 0x360;
        break;
      case 0xb9d8:
        pDVar12 = insn_info + 0xf;
        break;
      case 0xb9d9:
        pDVar12 = insn_info + 0x25b;
        break;
      case 0xb9da:
        pDVar12 = insn_info + 0x25;
        break;
      case 0xb9db:
        pDVar12 = insn_info + 0x266;
        break;
      case 0xb9dd:
        pDVar12 = insn_info + 0x81;
        break;
      case 0xb9df:
        pDVar12 = insn_info + 0x8d;
        break;
      case 0xb9e0:
        pDVar12 = insn_info + 0x184;
        break;
      case 0xb9e1:
        pDVar12 = insn_info + 0x1f9;
        break;
      case 0xb9e2:
        pDVar12 = insn_info + 0x17e;
        break;
      case 0xb9e4:
        pDVar12 = insn_info + 0x37;
        break;
      case 0xb9e6:
        pDVar12 = insn_info + 0x1e8;
        break;
      case 0xb9e7:
        pDVar12 = insn_info + 0xf8;
        break;
      case 0xb9e8:
        pDVar12 = insn_info + 6;
        break;
      case 0xb9e9:
        pDVar12 = insn_info + 0x250;
        break;
      case 0xb9ea:
        pDVar12 = insn_info + 0x21;
        break;
      case 0xb9eb:
        pDVar12 = insn_info + 0x262;
        break;
      case 0xb9f2:
        pDVar12 = insn_info + 0x17d;
        break;
      case 0xb9f4:
        pDVar12 = insn_info + 0x33;
        break;
      case 0xb9f6:
        pDVar12 = insn_info + 0x1e4;
        break;
      case 0xb9f7:
        pDVar12 = insn_info + 0xf4;
        break;
      case 0xb9f8:
        pDVar12 = insn_info + 1;
        break;
      case 0xb9f9:
        pDVar12 = insn_info + 0x24b;
        break;
      case 0xb9fa:
        pDVar12 = insn_info + 0x1c;
        break;
      case 0xb9fb:
        pDVar12 = insn_info + 0x25d;
        break;
      case 0xba00:
        pDVar12 = insn_info + 0xb3;
        break;
      default:
        if (uVar6 == 0xbb00) {
          pDVar12 = insn_info + 0xb6;
        }
        else {
          if (uVar6 != 0xbd00) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x9f;
        }
      }
    }
    else if (uVar6 < 0xc200) {
      switch(uVar6) {
      case 0xc000:
        pDVar12 = insn_info + 0x129;
        break;
      case 0xc001:
        pDVar12 = insn_info + 0x121;
        break;
      case 0xc002:
      case 0xc003:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xc004:
        pDVar12 = insn_info + 0x4b;
        break;
      case 0xc005:
        pDVar12 = insn_info + 0x47;
        break;
      case 0xc006:
        pDVar12 = insn_info + 0xfb;
        break;
      case 0xc007:
        pDVar12 = insn_info + 0xfc;
        break;
      case 0xc008:
        pDVar12 = insn_info + 0x10c;
        break;
      case 0xc009:
        pDVar12 = insn_info + 0x10d;
        break;
      case 0xc00a:
        pDVar12 = insn_info + 0x3a;
        break;
      case 0xc00b:
        pDVar12 = insn_info + 0x3b;
        break;
      case 0xc00c:
        pDVar12 = insn_info + 0x1eb;
        break;
      case 0xc00d:
        pDVar12 = insn_info + 0x1ec;
        break;
      case 0xc00e:
        pDVar12 = insn_info + 0x16b;
        break;
      case 0xc00f:
        pDVar12 = insn_info + 0x16c;
        break;
      default:
        if (uVar6 == 0xbe00) {
          pDVar12 = insn_info + 0x230;
        }
        else {
          if (uVar6 != 0xbf00) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x109;
        }
      }
    }
    else {
      switch(uVar6) {
      case 0xc200:
        pDVar12 = insn_info + 0x1da;
        break;
      case 0xc201:
        pDVar12 = insn_info + 0x1d9;
        break;
      case 0xc202:
      case 0xc203:
      case 0xc206:
      case 0xc207:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xc204:
        pDVar12 = insn_info + 0x268;
        break;
      case 0xc205:
        pDVar12 = insn_info + 0x267;
        break;
      case 0xc208:
        pDVar12 = insn_info + 0x13;
        break;
      case 0xc209:
        pDVar12 = insn_info + 0x10;
        break;
      case 0xc20a:
        pDVar12 = insn_info + 0x27;
        break;
      case 0xc20b:
        pDVar12 = insn_info + 0x26;
        break;
      case 0xc20c:
        pDVar12 = insn_info + 0x72;
        break;
      case 0xc20d:
        pDVar12 = insn_info + 0x71;
        break;
      case 0xc20e:
        pDVar12 = insn_info + 0x90;
        break;
      case 0xc20f:
        pDVar12 = insn_info + 0x8f;
        break;
      default:
        switch(uVar6) {
        case 0xc402:
          pDVar12 = insn_info + 0x169;
          break;
        default:
          goto switchD_00cba6cf_caseD_b90e;
        case 0xc404:
          pDVar12 = insn_info + 0x158;
          break;
        case 0xc405:
          pDVar12 = insn_info + 0x157;
          break;
        case 0xc406:
          pDVar12 = insn_info + 0x16a;
          break;
        case 0xc407:
          pDVar12 = insn_info + 0x236;
          break;
        case 0xc408:
          pDVar12 = insn_info + 0x123;
          break;
        case 0xc40b:
          pDVar12 = insn_info + 0x22c;
          break;
        case 0xc40c:
          pDVar12 = insn_info + 0x124;
          break;
        case 0xc40d:
          pDVar12 = insn_info + 0x122;
          break;
        case 0xc40e:
          pDVar12 = insn_info + 0x15e;
          break;
        case 0xc40f:
          pDVar12 = insn_info + 0x22b;
        }
      }
    }
    goto LAB_00cbaf11;
  }
  if (0xe6ff < uVar6) {
    if (uVar6 < 0xeb04) {
      switch(uVar6) {
      case 0xe700:
        pDVar12 = insn_info + 0x297;
        break;
      case 0xe701:
        pDVar12 = insn_info + 0x298;
        break;
      case 0xe702:
        pDVar12 = insn_info + 0x29a;
        break;
      case 0xe703:
        pDVar12 = insn_info + 0x299;
        break;
      case 0xe704:
        pDVar12 = insn_info + 0x2a0;
        break;
      case 0xe705:
        pDVar12 = insn_info + 0x296;
        break;
      case 0xe706:
        pDVar12 = insn_info + 0x294;
        break;
      case 0xe707:
        pDVar12 = insn_info + 0x2a2;
        break;
      case 0xe708:
        pDVar12 = insn_info + 0x2b4;
        break;
      case 0xe709:
        pDVar12 = insn_info + 0x2b5;
        break;
      case 0xe70a:
        pDVar12 = insn_info + 0x2b7;
        break;
      case 0xe70b:
        pDVar12 = insn_info + 0x2b6;
        break;
      case 0xe70c:
      case 0xe70d:
      case 0xe70f:
      case 0xe710:
      case 0xe711:
      case 0xe714:
      case 0xe715:
      case 0xe716:
      case 0xe717:
      case 0xe718:
      case 0xe719:
      case 0xe71c:
      case 0xe71d:
      case 0xe71e:
      case 0xe71f:
      case 0xe720:
      case 0xe723:
      case 0xe724:
      case 0xe725:
      case 0xe726:
      case 0xe728:
      case 0xe729:
      case 0xe72a:
      case 0xe72b:
      case 0xe72c:
      case 0xe72d:
      case 0xe72e:
      case 0xe72f:
      case 0xe731:
      case 0xe732:
      case 0xe734:
      case 0xe735:
      case 0xe739:
      case 0xe73b:
      case 0xe73c:
      case 0xe73d:
      case 0xe747:
      case 0xe748:
      case 0xe749:
      case 0xe74b:
      case 0xe74c:
      case 0xe74e:
      case 0xe74f:
      case 0xe751:
      case 0xe754:
      case 0xe755:
      case 0xe757:
      case 0xe758:
      case 0xe759:
      case 0xe75a:
      case 0xe75b:
      case 0xe75d:
      case 0xe75e:
      case 0xe763:
      case 0xe771:
      case 0xe776:
      case 0xe779:
      case 0xe77b:
      case 0xe783:
      case 0xe785:
      case 0xe786:
      case 0xe787:
      case 0xe788:
      case 0xe789:
      case 0xe78b:
      case 0xe790:
      case 0xe791:
      case 0xe792:
      case 0xe793:
      case 0xe796:
      case 0xe798:
      case 0xe799:
      case 0xe79a:
      case 0xe79b:
      case 0xe79c:
      case 0xe79d:
      case 0xe79e:
      case 0xe79f:
      case 0xe7a0:
      case 0xe7a8:
      case 0xe7b0:
      case 0xe7b1:
      case 0xe7b2:
      case 0xe7b3:
      case 0xe7b5:
      case 0xe7b6:
      case 0xe7b7:
      case 0xe7b8:
      case 0xe7ba:
      case 0xe7be:
      case 0xe7c6:
      case 0xe7c8:
      case 0xe7c9:
      case 0xe7cd:
      case 0xe7cf:
      case 0xe7d0:
      case 0xe7d1:
      case 0xe7d2:
      case 0xe7d3:
      case 0xe7da:
      case 0xe7dc:
      case 0xe7dd:
      case 0xe7e0:
      case 0xe7e1:
      case 0xe7e4:
      case 0xe7e6:
      case 0xe7e9:
      case 0xe7ec:
      case 0xe7ed:
      case 0xe7ee:
      case 0xe7ef:
      case 0xe7f4:
      case 0xe7f6:
      case 0xe7fa:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xe70e:
        pDVar12 = insn_info + 0x2b3;
        break;
      case 0xe712:
        pDVar12 = insn_info + 0x291;
        break;
      case 0xe713:
        pDVar12 = insn_info + 0x290;
        break;
      case 0xe71a:
        pDVar12 = insn_info + 0x2b0;
        break;
      case 0xe71b:
        pDVar12 = insn_info + 0x2af;
        break;
      case 0xe721:
        pDVar12 = insn_info + 0x29f;
        break;
      case 0xe722:
        pDVar12 = insn_info + 0x2a3;
        break;
      case 0xe727:
        pDVar12 = insn_info + 0x14e;
        break;
      case 0xe730:
        pDVar12 = insn_info + 0x2ef;
        break;
      case 0xe733:
        pDVar12 = insn_info + 0x2ec;
        break;
      case 0xe736:
        pDVar12 = insn_info + 0x2a1;
        break;
      case 0xe737:
        pDVar12 = insn_info + 0x2a5;
        break;
      case 0xe738:
        pDVar12 = insn_info + 0x2f3;
        break;
      case 0xe73a:
        pDVar12 = insn_info + 0x2f1;
        break;
      case 0xe73e:
        pDVar12 = insn_info + 0x2b8;
        break;
      case 0xe73f:
        pDVar12 = insn_info + 0x2b9;
        break;
      case 0xe740:
        pDVar12 = insn_info + 0x29b;
        break;
      case 0xe741:
        pDVar12 = insn_info + 0x29c;
        break;
      case 0xe742:
        pDVar12 = insn_info + 0x29e;
        break;
      case 0xe743:
        pDVar12 = insn_info + 0x29d;
        break;
      case 0xe744:
        pDVar12 = insn_info + 0x292;
        break;
      case 0xe745:
        pDVar12 = insn_info + 0x2ae;
        break;
      case 0xe746:
        pDVar12 = insn_info + 0x293;
        break;
      case 0xe74a:
        pDVar12 = insn_info + 0x31c;
        break;
      case 0xe74d:
        pDVar12 = insn_info + 0x2ad;
        break;
      case 0xe750:
        pDVar12 = insn_info + 0x2ea;
        break;
      case 0xe752:
        pDVar12 = insn_info + 0x2cd;
        break;
      case 0xe753:
        pDVar12 = insn_info + 0x2cc;
        break;
      case 0xe756:
        pDVar12 = insn_info + 0x295;
        break;
      case 0xe75c:
        pDVar12 = insn_info + 0x306;
        break;
      case 0xe75f:
        pDVar12 = insn_info + 0x2b2;
        break;
      case 0xe760:
        pDVar12 = insn_info + 0x2a7;
        break;
      case 0xe761:
        pDVar12 = insn_info + 0x2a6;
        break;
      case 0xe762:
        pDVar12 = insn_info + 0x2a4;
        break;
      case 0xe764:
        pDVar12 = insn_info + 0x301;
        break;
      case 0xe765:
        pDVar12 = insn_info + 0x2ff;
        break;
      case 0xe766:
        pDVar12 = insn_info + 0x2c6;
        break;
      case 0xe767:
        pDVar12 = insn_info + 0x300;
        break;
      case 0xe768:
        pDVar12 = insn_info + 0x2c2;
        break;
      case 0xe769:
        pDVar12 = insn_info + 0x2c3;
        break;
      case 0xe76a:
        pDVar12 = insn_info + 0x2e8;
        break;
      case 0xe76b:
        pDVar12 = insn_info + 0x2e6;
        break;
      case 0xe76c:
        pDVar12 = insn_info + 0x2e7;
        break;
      case 0xe76d:
        pDVar12 = insn_info + 0x2ce;
        break;
      case 0xe76e:
        pDVar12 = insn_info + 0x2e5;
        break;
      case 0xe76f:
        pDVar12 = insn_info + 0x2e9;
        break;
      case 0xe770:
        pDVar12 = insn_info + 0x2ee;
        break;
      case 0xe772:
        pDVar12 = insn_info + 0x2ed;
        break;
      case 0xe773:
        pDVar12 = insn_info + 0x2eb;
        break;
      case 0xe774:
        pDVar12 = insn_info + 0x2f4;
        break;
      case 0xe775:
        pDVar12 = insn_info + 0x2f5;
        break;
      case 0xe777:
        pDVar12 = insn_info + 0x2f6;
        break;
      case 0xe778:
        pDVar12 = insn_info + 0x2f2;
        break;
      case 0xe77a:
        pDVar12 = insn_info + 0x2f0;
        break;
      case 0xe77c:
        pDVar12 = insn_info + 0x2f9;
        break;
      case 0xe77d:
        pDVar12 = insn_info + 0x2fa;
        break;
      case 0xe77e:
        pDVar12 = insn_info + 0x2f7;
        break;
      case 0xe77f:
        pDVar12 = insn_info + 0x2f8;
        break;
      case 0xe780:
        pDVar12 = insn_info + 0x304;
        break;
      case 0xe781:
        pDVar12 = insn_info + 0x305;
        break;
      case 0xe782:
        pDVar12 = insn_info + 0x303;
        break;
      case 0xe784:
        pDVar12 = insn_info + 0x2ac;
        break;
      case 0xe78a:
        pDVar12 = insn_info + 0x307;
        break;
      case 0xe78c:
        pDVar12 = insn_info + 0x2ab;
        break;
      case 0xe78d:
        pDVar12 = insn_info + 0x2b1;
        break;
      case 0xe78e:
        pDVar12 = insn_info + 0x318;
        break;
      case 0xe78f:
        pDVar12 = insn_info + 0x317;
        break;
      case 0xe794:
        pDVar12 = insn_info + 0x2a8;
        break;
      case 0xe795:
        pDVar12 = insn_info + 0x2aa;
        break;
      case 0xe797:
        pDVar12 = insn_info + 0x2a9;
        break;
      case 0xe7a1:
        pDVar12 = insn_info + 0x2df;
        break;
      case 0xe7a2:
        pDVar12 = insn_info + 0x2e0;
        break;
      case 0xe7a3:
        pDVar12 = insn_info + 0x2de;
        break;
      case 0xe7a4:
        pDVar12 = insn_info + 0x2e2;
        break;
      case 0xe7a5:
        pDVar12 = insn_info + 0x2e4;
        break;
      case 0xe7a6:
        pDVar12 = insn_info + 0x2e1;
        break;
      case 0xe7a7:
        pDVar12 = insn_info + 0x2e3;
        break;
      case 0xe7a9:
        pDVar12 = insn_info + 0x2d9;
        break;
      case 0xe7aa:
        pDVar12 = insn_info + 0x2d7;
        break;
      case 0xe7ab:
        pDVar12 = insn_info + 0x2d8;
        break;
      case 0xe7ac:
        pDVar12 = insn_info + 0x2db;
        break;
      case 0xe7ad:
        pDVar12 = insn_info + 0x2dd;
        break;
      case 0xe7ae:
        pDVar12 = insn_info + 0x2da;
        break;
      case 0xe7af:
        pDVar12 = insn_info + 0x2dc;
        break;
      case 0xe7b4:
        pDVar12 = insn_info + 0x2cf;
        break;
      case 0xe7b9:
        pDVar12 = insn_info + 0x2c1;
        break;
      case 0xe7bb:
        pDVar12 = insn_info + 0x2c0;
        break;
      case 0xe7bc:
        pDVar12 = insn_info + 0x2d0;
        break;
      case 0xe7bd:
        pDVar12 = insn_info + 0x2fe;
        break;
      case 0xe7bf:
        pDVar12 = insn_info + 0x2fd;
        break;
      case 0xe7c0:
        pDVar12 = insn_info + 0x311;
        break;
      case 0xe7c1:
        pDVar12 = insn_info + 0x30f;
        break;
      case 0xe7c2:
        pDVar12 = insn_info + 0x310;
        break;
      case 0xe7c3:
        pDVar12 = insn_info + 0x30e;
        break;
      case 0xe7c4:
        pDVar12 = insn_info + 0x314;
        break;
      case 0xe7c5:
        pDVar12 = insn_info + 0x315;
        break;
      case 0xe7c7:
        pDVar12 = insn_info + 0x313;
        break;
      case 0xe7ca:
        pDVar12 = insn_info + 0x30a;
        break;
      case 0xe7cb:
        pDVar12 = insn_info + 0x309;
        break;
      case 0xe7cc:
        pDVar12 = insn_info + 0x319;
        break;
      case 0xe7ce:
        pDVar12 = insn_info + 0x31a;
        break;
      case 0xe7d4:
        pDVar12 = insn_info + 0x2bd;
        break;
      case 0xe7d5:
        pDVar12 = insn_info + 699;
        break;
      case 0xe7d6:
        pDVar12 = insn_info + 700;
        break;
      case 0xe7d7:
        pDVar12 = insn_info + 0x2ba;
        break;
      case 0xe7d8:
        pDVar12 = insn_info + 0x302;
        break;
      case 0xe7d9:
        pDVar12 = insn_info + 0x2c8;
        break;
      case 0xe7db:
        pDVar12 = insn_info + 0x2c7;
        break;
      case 0xe7de:
        pDVar12 = insn_info + 0x2d1;
        break;
      case 0xe7df:
        pDVar12 = insn_info + 0x2d2;
        break;
      case 0xe7e2:
        pDVar12 = insn_info + 0x31b;
        break;
      case 0xe7e3:
        pDVar12 = insn_info + 0x308;
        break;
      case 0xe7e5:
        pDVar12 = insn_info + 0x312;
        break;
      case 0xe7e7:
        pDVar12 = insn_info + 0x316;
        break;
      case 0xe7e8:
        pDVar12 = insn_info + 0x30b;
        break;
      case 0xe7ea:
        pDVar12 = insn_info + 0x30d;
        break;
      case 0xe7eb:
        pDVar12 = insn_info + 0x30c;
        break;
      case 0xe7f0:
        pDVar12 = insn_info + 0x2c5;
        break;
      case 0xe7f1:
        pDVar12 = insn_info + 0x2bf;
        break;
      case 0xe7f2:
        pDVar12 = insn_info + 0x2c4;
        break;
      case 0xe7f3:
        pDVar12 = insn_info + 0x2be;
        break;
      case 0xe7f5:
        pDVar12 = insn_info + 0x2fc;
        break;
      case 0xe7f7:
        pDVar12 = insn_info + 0x2fb;
        break;
      case 0xe7f8:
        pDVar12 = insn_info + 0x2c9;
        break;
      case 0xe7f9:
        pDVar12 = insn_info + 0x2cb;
        break;
      case 0xe7fb:
        pDVar12 = insn_info + 0x2ca;
        break;
      case 0xe7fc:
        pDVar12 = insn_info + 0x2d6;
        break;
      case 0xe7fd:
        pDVar12 = insn_info + 0x2d4;
        break;
      case 0xe7fe:
        pDVar12 = insn_info + 0x2d5;
        break;
      case 0xe7ff:
        pDVar12 = insn_info + 0x2d3;
        break;
      case 0xe800:
        pDVar12 = insn_info + 0x1b4;
        break;
      default:
        if (uVar6 == 0xe900) {
          pDVar12 = insn_info + 500;
        }
        else {
          if (uVar6 != 0xea00) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x283;
        }
      }
      goto LAB_00cbaf11;
    }
    if (uVar6 < 0xec42) {
      if (uVar6 < 0xeb7a) {
        if (uVar6 < 0xeb1c) {
          switch(uVar6) {
          case 0xeb0a:
            pDVar12 = insn_info + 0x217;
            break;
          case 0xeb0b:
            pDVar12 = insn_info + 0x211;
            break;
          case 0xeb0c:
            pDVar12 = insn_info + 0x21a;
            break;
          case 0xeb0d:
            pDVar12 = insn_info + 0x214;
            break;
          case 0xeb0e:
          case 0xeb0f:
          case 0xeb10:
          case 0xeb11:
          case 0xeb12:
          case 0xeb13:
            goto switchD_00cba6cf_caseD_b90e;
          case 0xeb14:
            pDVar12 = insn_info + 0xb4;
            break;
          default:
            if (uVar6 != 0xeb04) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x1aa;
          }
        }
        else {
          switch(uVar6) {
          case 0xeb1c:
            pDVar12 = insn_info + 0x1fb;
            break;
          case 0xeb1d:
            pDVar12 = insn_info + 0x1fa;
            break;
          case 0xeb1e:
          case 0xeb1f:
          case 0xeb22:
          case 0xeb27:
          case 0xeb28:
          case 0xeb29:
          case 0xeb2a:
          case 0xeb2e:
          case 0xeb32:
          case 0xeb33:
          case 0xeb34:
          case 0xeb35:
          case 0xeb36:
          case 0xeb37:
          case 0xeb38:
          case 0xeb39:
          case 0xeb3a:
          case 0xeb3b:
          case 0xeb3c:
          case 0xeb3d:
          case 0xeb3f:
          case 0xeb40:
          case 0xeb41:
          case 0xeb42:
          case 0xeb43:
          case 0xeb46:
          case 0xeb47:
          case 0xeb48:
          case 0xeb49:
          case 0xeb4a:
          case 0xeb4b:
          case 0xeb4d:
          case 0xeb4e:
          case 0xeb4f:
          case 0xeb50:
          case 0xeb53:
            goto switchD_00cba6cf_caseD_b90e;
          case 0xeb20:
            pDVar12 = insn_info + 0xa1;
            break;
          case 0xeb21:
            pDVar12 = insn_info + 0xa0;
            break;
          case 0xeb23:
            pDVar12 = insn_info + 0xc0;
            break;
          case 0xeb24:
            pDVar12 = insn_info + 0x245;
            break;
          case 0xeb25:
            pDVar12 = insn_info + 0x33e;
            break;
          case 0xeb26:
            pDVar12 = insn_info + 0x246;
            break;
          case 0xeb2b:
            pDVar12 = insn_info + 0xc1;
            break;
          case 0xeb2c:
            pDVar12 = insn_info + 0x232;
            break;
          case 0xeb2d:
            pDVar12 = insn_info + 0x231;
            break;
          case 0xeb2f:
            pDVar12 = insn_info + 0x324;
            break;
          case 0xeb30:
            pDVar12 = insn_info + 0xb5;
            break;
          case 0xeb31:
            pDVar12 = insn_info + 0xb7;
            break;
          case 0xeb3e:
            pDVar12 = insn_info + 0xb8;
            break;
          case 0xeb44:
            pDVar12 = insn_info + 0x55;
            break;
          case 0xeb45:
            pDVar12 = insn_info + 0x56;
            break;
          case 0xeb4c:
            pDVar12 = insn_info + 0x102;
            break;
          case 0xeb51:
            pDVar12 = insn_info + 0x275;
            break;
          case 0xeb52:
            pDVar12 = insn_info + 0x1b3;
            break;
          case 0xeb54:
            pDVar12 = insn_info + 0x41;
            break;
          case 0xeb55:
            pDVar12 = insn_info + 0x92;
            break;
          case 0xeb56:
            pDVar12 = insn_info + 0x1f2;
            break;
          case 0xeb57:
            pDVar12 = insn_info + 0xfe;
            break;
          default:
            if (uVar6 == 0xeb6a) {
              pDVar12 = insn_info + 0x11;
            }
            else {
              if (uVar6 != 0xeb6e) goto switchD_00cba6cf_caseD_b90e;
              pDVar12 = insn_info + 0x28;
            }
          }
        }
      }
      else if (uVar6 < 0xebd0) {
        switch(uVar6) {
        case 0xeb8e:
          pDVar12 = insn_info + 0x1b7;
          break;
        case 0xeb8f:
          pDVar12 = insn_info + 0x9e;
          break;
        case 0xeb90:
          pDVar12 = insn_info + 0x244;
          break;
        case 0xeb91:
        case 0xeb92:
        case 0xeb93:
        case 0xeb94:
        case 0xeb95:
        case 0xeb97:
        case 0xeb99:
          goto switchD_00cba6cf_caseD_b90e;
        case 0xeb96:
          pDVar12 = insn_info + 0x1ab;
          break;
        case 0xeb98:
          pDVar12 = insn_info + 0x1a9;
          break;
        case 0xeb9a:
          pDVar12 = insn_info + 0x1ad;
          break;
        case 0xeb9b:
          pDVar12 = insn_info + 0x248;
          break;
        default:
          switch(uVar6) {
          case 0xeb7a:
            pDVar12 = insn_info + 0x14;
            break;
          case 0xeb7b:
          case 0xeb7c:
          case 0xeb7d:
          case 0xeb7f:
            goto switchD_00cba6cf_caseD_b90e;
          case 0xeb7e:
            pDVar12 = insn_info + 0x2a;
            break;
          case 0xeb80:
            pDVar12 = insn_info + 0x10b;
            break;
          case 0xeb81:
            pDVar12 = insn_info + 0x10a;
            break;
          default:
            if (uVar6 != 0xebc0) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x273;
          }
        }
      }
      else {
        switch(uVar6) {
        case 0xebd0:
          pDVar12 = insn_info + 0x35b;
          break;
        case 0xebd1:
          pDVar12 = insn_info + 0x35c;
          break;
        default:
          goto switchD_00cba6cf_caseD_b90e;
        case 0xebdc:
          pDVar12 = insn_info + 0x216;
          break;
        case 0xebdd:
          pDVar12 = insn_info + 0x210;
          break;
        case 0xebde:
          pDVar12 = insn_info + 0x219;
          break;
        case 0xebdf:
          pDVar12 = insn_info + 0x213;
          break;
        case 0xebe0:
          pDVar12 = insn_info + 0x185;
          break;
        case 0xebe1:
          pDVar12 = insn_info + 0x23a;
          break;
        case 0xebe2:
          pDVar12 = insn_info + 0x180;
          break;
        case 0xebe3:
          pDVar12 = insn_info + 0x239;
          break;
        case 0xebe4:
          pDVar12 = insn_info + 0x12f;
          break;
        case 0xebe6:
          pDVar12 = insn_info + 0x133;
          break;
        case 0xebe7:
          pDVar12 = insn_info + 0x131;
          break;
        case 0xebe8:
          pDVar12 = insn_info + 299;
          break;
        case 0xebea:
          pDVar12 = insn_info + 0x12d;
          break;
        case 0xebf2:
          pDVar12 = insn_info + 0x17f;
          break;
        case 0xebf3:
          pDVar12 = insn_info + 0x238;
          break;
        case 0xebf4:
          pDVar12 = insn_info + 0x12e;
          break;
        case 0xebf6:
          pDVar12 = insn_info + 0x132;
          break;
        case 0xebf7:
          pDVar12 = insn_info + 0x130;
          break;
        case 0xebf8:
          pDVar12 = insn_info + 0x12a;
          break;
        case 0xebfa:
          pDVar12 = insn_info + 300;
        }
      }
    }
    else if (uVar6 < 0xed64) {
      switch(uVar6) {
      case 0xecd8:
        pDVar12 = insn_info + 0x12;
        break;
      case 0xecd9:
        pDVar12 = insn_info + 0x15;
        break;
      case 0xecda:
        pDVar12 = insn_info + 0x29;
        break;
      case 0xecdb:
        pDVar12 = insn_info + 0x2b;
        break;
      case 0xecdc:
      case 0xecdd:
      case 0xecde:
      case 0xecdf:
      case 0xece0:
      case 0xece1:
      case 0xece2:
      case 0xece3:
      case 0xece6:
      case 0xece7:
      case 0xece8:
      case 0xece9:
      case 0xecea:
      case 0xeceb:
      case 0xecec:
      case 0xeced:
      case 0xecee:
      case 0xecef:
      case 0xecf0:
      case 0xecf1:
      case 0xecf2:
      case 0xecf3:
      case 0xecf4:
      case 0xecf5:
      case 0xecf8:
      case 0xecf9:
      case 0xecfa:
      case 0xecfb:
      case 0xed00:
      case 0xed01:
      case 0xed02:
      case 0xed03:
      case 0xed13:
      case 0xed16:
      case 0xed20:
      case 0xed21:
      case 0xed22:
      case 0xed23:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xece4:
        pDVar12 = insn_info + 0xa4;
        break;
      case 0xece5:
        pDVar12 = insn_info + 0xac;
        break;
      case 0xecf6:
        pDVar12 = insn_info + 0xa3;
        break;
      case 0xecf7:
        pDVar12 = insn_info + 0xab;
        break;
      case 0xecfc:
        pDVar12 = insn_info + 0xa8;
        break;
      case 0xecfd:
        pDVar12 = insn_info + 0xb0;
        break;
      case 0xecfe:
        pDVar12 = insn_info + 0xa7;
        break;
      case 0xecff:
        pDVar12 = insn_info + 0xaf;
        break;
      case 0xed04:
        pDVar12 = insn_info + 0x1a0;
        break;
      case 0xed05:
        pDVar12 = insn_info + 0x1a1;
        break;
      case 0xed06:
        pDVar12 = insn_info + 0x1a2;
        break;
      case 0xed07:
        pDVar12 = insn_info + 0x1c9;
        break;
      case 0xed08:
        pDVar12 = insn_info + 0x6f;
        break;
      case 0xed09:
        pDVar12 = insn_info + 0x6a;
        break;
      case 0xed0a:
        pDVar12 = insn_info + 0xc;
        break;
      case 0xed0b:
        pDVar12 = insn_info + 0x256;
        break;
      case 0xed0c:
        pDVar12 = insn_info + 0x1c8;
        break;
      case 0xed0d:
        pDVar12 = insn_info + 0xe9;
        break;
      case 0xed0e:
        pDVar12 = insn_info + 0x1dd;
        break;
      case 0xed0f:
        pDVar12 = insn_info + 0x1e1;
        break;
      case 0xed10:
        pDVar12 = insn_info + 0x270;
        break;
      case 0xed11:
        pDVar12 = insn_info + 0x271;
        break;
      case 0xed12:
        pDVar12 = insn_info + 0x272;
        break;
      case 0xed14:
        pDVar12 = insn_info + 0x222;
        break;
      case 0xed15:
        pDVar12 = insn_info + 0x223;
        break;
      case 0xed17:
        pDVar12 = insn_info + 0x1c6;
        break;
      case 0xed18:
        pDVar12 = insn_info + 0x70;
        break;
      case 0xed19:
        pDVar12 = insn_info + 0x6b;
        break;
      case 0xed1a:
        pDVar12 = insn_info + 0xd;
        break;
      case 0xed1b:
        pDVar12 = insn_info + 599;
        break;
      case 0xed1c:
        pDVar12 = insn_info + 0x1c7;
        break;
      case 0xed1d:
        pDVar12 = insn_info + 0xea;
        break;
      case 0xed1e:
        pDVar12 = insn_info + 0x1de;
        break;
      case 0xed1f:
        pDVar12 = insn_info + 0x1e2;
        break;
      case 0xed24:
        pDVar12 = insn_info + 0x1a4;
        break;
      default:
        switch(uVar6) {
        case 0xec42:
          pDVar12 = insn_info + 0x181;
          break;
        case 0xec43:
        case 0xec47:
        case 0xec48:
        case 0xec49:
        case 0xec4a:
        case 0xec4b:
        case 0xec4c:
        case 0xec4d:
        case 0xec4f:
        case 0xec50:
        case 0xec52:
        case 0xec53:
        case 0xec58:
        case 0xec5a:
        case 0xec5b:
        case 0xec5c:
          goto switchD_00cba6cf_caseD_b90e;
        case 0xec44:
          pDVar12 = insn_info + 0x59;
          break;
        case 0xec45:
          pDVar12 = insn_info + 0x5a;
          break;
        case 0xec46:
          pDVar12 = insn_info + 0x182;
          break;
        case 0xec4e:
          pDVar12 = insn_info + 0x183;
          break;
        case 0xec51:
          pDVar12 = insn_info + 0x1ff;
          break;
        case 0xec54:
          pDVar12 = insn_info + 0x200;
          break;
        case 0xec55:
          pDVar12 = insn_info + 0x1fc;
          break;
        case 0xec56:
          pDVar12 = insn_info + 0x201;
          break;
        case 0xec57:
          pDVar12 = insn_info + 0x202;
          break;
        case 0xec59:
          pDVar12 = insn_info + 0x1fd;
          break;
        case 0xec5d:
          pDVar12 = insn_info + 0x1fe;
          break;
        default:
          switch(uVar6) {
          case 0xec64:
            pDVar12 = insn_info + 0xa6;
            break;
          case 0xec65:
            pDVar12 = insn_info + 0xae;
            break;
          default:
            goto switchD_00cba6cf_caseD_b90e;
          case 0xec70:
            pDVar12 = insn_info + 0xbd;
            break;
          case 0xec71:
            pDVar12 = insn_info + 0xc3;
            break;
          case 0xec72:
            pDVar12 = insn_info + 0xbc;
            break;
          case 0xec73:
            pDVar12 = insn_info + 0xc2;
            break;
          case 0xec76:
            pDVar12 = insn_info + 0xa5;
            break;
          case 0xec77:
            pDVar12 = insn_info + 0xad;
            break;
          case 0xec7c:
            pDVar12 = insn_info + 0xaa;
            break;
          case 0xec7d:
            pDVar12 = insn_info + 0xb2;
            break;
          case 0xec7e:
            pDVar12 = insn_info + 0xa9;
            break;
          case 0xec7f:
            pDVar12 = insn_info + 0xb1;
          }
        }
      }
    }
    else if (uVar6 < 0xf100) {
      switch(uVar6) {
      case 0xed64:
        pDVar12 = insn_info + 0x11f;
        break;
      case 0xed65:
        pDVar12 = insn_info + 0x11c;
        break;
      case 0xed66:
        pDVar12 = insn_info + 0x22a;
        break;
      case 0xed67:
        pDVar12 = insn_info + 0x228;
        break;
      default:
        goto switchD_00cba6cf_caseD_b90e;
      }
    }
    else if (uVar6 == 0xf100) {
      pDVar12 = insn_info + 0x1bc;
    }
    else if (uVar6 == 0xf200) {
      pDVar12 = insn_info + 499;
    }
    else {
      if (uVar6 != 0xf300) goto switchD_00cba6cf_caseD_b90e;
      pDVar12 = insn_info + 0x282;
    }
    goto LAB_00cbaf11;
  }
  if (uVar6 < 0xe302) {
    if (0xcc05 < uVar6) {
      if (uVar6 < 0xd400) {
        if (uVar6 < 0xd000) {
          switch(uVar6) {
          case 0xcc06:
            pDVar12 = insn_info + 0x52;
            break;
          default:
            goto switchD_00cba6cf_caseD_b90e;
          case 0xcc08:
            pDVar12 = insn_info + 0x16;
            break;
          case 0xcc0a:
            pDVar12 = insn_info + 0x2c;
            break;
          case 0xcc0b:
            pDVar12 = insn_info + 0x2d;
            break;
          case 0xcc0d:
            pDVar12 = insn_info + 0x83;
            break;
          case 0xcc0f:
            pDVar12 = insn_info + 0x96;
          }
        }
        else if (uVar6 < 0xd200) {
          if (uVar6 == 0xd000) {
            pDVar12 = insn_info + 0x27c;
          }
          else {
            if (uVar6 != 0xd100) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x1b8;
          }
        }
        else if (uVar6 == 0xd200) {
          pDVar12 = insn_info + 0x1ae;
        }
        else {
          if (uVar6 != 0xd300) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x1bd;
        }
      }
      else if (uVar6 < 0xdb00) {
        if (uVar6 < 0xd600) {
          if (uVar6 == 0xd400) {
            pDVar12 = insn_info + 0x39;
          }
          else {
            if (uVar6 != 0xd500) goto switchD_00cba6cf_caseD_b90e;
            pDVar12 = insn_info + 0x8b;
          }
        }
        else if (uVar6 == 0xd600) {
          pDVar12 = insn_info + 0x1ea;
        }
        else if (uVar6 == 0xd700) {
          pDVar12 = insn_info + 0xfa;
        }
        else {
          if (uVar6 != 0xda00) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x32d;
        }
      }
      else if (uVar6 < 0xdd00) {
        if (uVar6 == 0xdb00) {
          pDVar12 = insn_info + 0x32e;
        }
        else {
          if (uVar6 != 0xdc00) goto switchD_00cba6cf_caseD_b90e;
          pDVar12 = insn_info + 0x27a;
        }
      }
      else if (uVar6 == 0xdd00) {
        pDVar12 = insn_info + 0x27b;
      }
      else if (uVar6 == 0xe100) {
        pDVar12 = insn_info + 0x1f5;
      }
      else {
        if (uVar6 != 0xe200) goto switchD_00cba6cf_caseD_b90e;
        pDVar12 = insn_info + 0x284;
      }
      goto LAB_00cbaf11;
    }
    if (uVar6 < 0xc700) {
      switch(uVar6) {
      case 0xc600:
        pDVar12 = insn_info + 0x100;
        break;
      case 0xc601:
      case 0xc603:
      case 0xc609:
      case 0xc60b:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xc602:
        pDVar12 = insn_info + 0x1f7;
        break;
      case 0xc604:
        pDVar12 = insn_info + 0x7f;
        break;
      case 0xc605:
        pDVar12 = insn_info + 0x7e;
        break;
      case 0xc606:
        pDVar12 = insn_info + 0x9b;
        break;
      case 0xc607:
        pDVar12 = insn_info + 0x9a;
        break;
      case 0xc608:
        pDVar12 = insn_info + 0x74;
        break;
      case 0xc60a:
        pDVar12 = insn_info + 0x98;
        break;
      case 0xc60c:
        pDVar12 = insn_info + 0x75;
        break;
      case 0xc60d:
        pDVar12 = insn_info + 0x73;
        break;
      case 0xc60e:
        pDVar12 = insn_info + 0x99;
        break;
      case 0xc60f:
        pDVar12 = insn_info + 0x97;
        break;
      default:
        if (uVar6 != 0xc500) goto switchD_00cba6cf_caseD_b90e;
        pDVar12 = insn_info + 0x5c;
      }
    }
    else {
      switch(uVar6) {
      case 0xc800:
        pDVar12 = insn_info + 0x1bb;
        break;
      case 0xc801:
        pDVar12 = insn_info + 0x103;
        break;
      case 0xc802:
        pDVar12 = insn_info + 0xb9;
        break;
      case 0xc803:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xc804:
        pDVar12 = insn_info + 0x186;
        break;
      case 0xc805:
        pDVar12 = insn_info + 0x187;
        break;
      default:
        if (uVar6 != 0xc700) goto switchD_00cba6cf_caseD_b90e;
        pDVar12 = insn_info + 0x5b;
      }
    }
    goto LAB_00cbaf11;
  }
  if (0xe543 < uVar6) {
    if (uVar6 < 0xe554) {
      if (uVar6 == 0xe544) {
        pDVar12 = insn_info + 0x1af;
      }
      else if (uVar6 == 0xe548) {
        pDVar12 = insn_info + 0x1b1;
      }
      else {
        if (uVar6 != 0xe54c) goto switchD_00cba6cf_caseD_b90e;
        pDVar12 = insn_info + 0x1b0;
      }
    }
    else {
      switch(uVar6) {
      case 0xe554:
        pDVar12 = insn_info + 0x7b;
        break;
      case 0xe555:
        pDVar12 = insn_info + 0x93;
        break;
      default:
        goto switchD_00cba6cf_caseD_b90e;
      case 0xe558:
        pDVar12 = insn_info + 0x7d;
        break;
      case 0xe559:
        pDVar12 = insn_info + 0x95;
        break;
      case 0xe55c:
        pDVar12 = insn_info + 0x7c;
        break;
      case 0xe55d:
        pDVar12 = insn_info + 0x94;
      }
    }
    goto LAB_00cbaf11;
  }
  switch(uVar6) {
  case 0xe302:
    pDVar12 = insn_info + 0x138;
    break;
  case 0xe303:
    pDVar12 = insn_info + 0x32a;
    break;
  case 0xe304:
    pDVar12 = insn_info + 0x118;
    break;
  case 0xe305:
  case 0xe306:
  case 0xe307:
  case 0xe30e:
  case 0xe310:
  case 0xe311:
  case 0xe322:
  case 0xe323:
  case 0xe325:
  case 0xe327:
  case 0xe328:
  case 0xe329:
  case 0xe32b:
  case 0xe32c:
  case 0xe32d:
  case 0xe32e:
  case 0xe333:
  case 0xe335:
  case 0xe337:
  case 0xe338:
  case 0xe339:
  case 0xe33b:
  case 0xe33c:
  case 0xe33d:
  case 0xe340:
  case 0xe341:
  case 0xe342:
  case 0xe343:
  case 0xe344:
  case 0xe345:
  case 0xe347:
  case 0xe348:
  case 0xe349:
  case 0xe34a:
  case 0xe34b:
  case 0xe34c:
  case 0xe34d:
  case 0xe34e:
  case 0xe34f:
  case 0xe352:
  case 0xe353:
  case 0xe35d:
  case 0xe360:
  case 0xe361:
  case 0xe362:
  case 0xe363:
  case 0xe364:
  case 0xe365:
  case 0xe366:
  case 0xe367:
  case 0xe368:
  case 0xe369:
  case 0xe36a:
  case 0xe36b:
  case 0xe36c:
  case 0xe36d:
  case 0xe36e:
  case 0xe36f:
  case 0xe374:
  case 0xe37d:
  case 0xe37e:
  case 0xe37f:
  case 0xe383:
  case 0xe384:
  case 0xe38a:
  case 0xe38b:
  case 0xe38c:
  case 0xe38d:
  case 0xe392:
  case 0xe393:
  case 0xe39a:
  case 0xe39b:
  case 0xe39e:
  case 0xe3a0:
  case 0xe3a1:
  case 0xe3a2:
  case 0xe3a3:
  case 0xe3a4:
  case 0xe3a5:
  case 0xe3a6:
  case 0xe3a7:
  case 0xe3a8:
  case 0xe3a9:
  case 0xe3aa:
  case 0xe3ab:
  case 0xe3ac:
  case 0xe3ad:
  case 0xe3ae:
  case 0xe3af:
  case 0xe3b0:
  case 0xe3b1:
  case 0xe3b2:
  case 0xe3b3:
  case 0xe3b4:
  case 0xe3b5:
  case 0xe3b6:
  case 0xe3b7:
  case 0xe3b8:
  case 0xe3b9:
  case 0xe3ba:
  case 0xe3bb:
  case 0xe3bc:
  case 0xe3bd:
  case 0xe3be:
  case 0xe3bf:
  case 0xe3c1:
  case 0xe3c5:
  case 0xe3c9:
  case 0xe3cc:
  case 0xe3ce:
  case 0xe3d1:
  case 0xe3d2:
  case 0xe3d3:
  case 0xe3d5:
  case 0xe3d6:
  case 0xe3d7:
  case 0xe3d8:
  case 0xe3d9:
  case 0xe3da:
  case 0xe3db:
  case 0xe3dc:
  case 0xe3dd:
  case 0xe3de:
  case 0xe3df:
  case 0xe3e0:
  case 0xe3e1:
  case 0xe3e2:
  case 0xe3e3:
  case 0xe3e4:
  case 0xe3e5:
  case 0xe3e6:
  case 0xe3e7:
  case 0xe3e8:
  case 0xe3e9:
  case 0xe3ea:
switchD_00cba6cf_caseD_b90e:
    s->insn = (DisasInsn *)0x0;
    pDVar12 = (DisasInsn *)0x0;
    goto LAB_00cbb075;
  case 0xe308:
    pDVar12 = insn_info + 7;
    break;
  case 0xe309:
    pDVar12 = insn_info + 0x251;
    break;
  case 0xe30a:
    pDVar12 = insn_info + 0x22;
    break;
  case 0xe30b:
    pDVar12 = insn_info + 0x263;
    break;
  case 0xe30c:
    pDVar12 = insn_info + 0x1d7;
    break;
  case 0xe30d:
    pDVar12 = insn_info + 0xf1;
    break;
  case 0xe30f:
    pDVar12 = insn_info + 0x194;
    break;
  case 0xe312:
    pDVar12 = insn_info + 0x137;
    break;
  case 0xe313:
    pDVar12 = insn_info + 0x329;
    break;
  case 0xe314:
    pDVar12 = insn_info + 0x119;
    break;
  case 0xe315:
    pDVar12 = insn_info + 0x153;
    break;
  case 0xe316:
    pDVar12 = insn_info + 0x15c;
    break;
  case 0xe317:
    pDVar12 = insn_info + 0x172;
    break;
  case 0xe318:
    pDVar12 = insn_info + 8;
    break;
  case 0xe319:
    pDVar12 = insn_info + 0x252;
    break;
  case 0xe31a:
    pDVar12 = insn_info + 0x23;
    break;
  case 0xe31b:
    pDVar12 = insn_info + 0x264;
    break;
  case 0xe31c:
    pDVar12 = insn_info + 0x1d8;
    break;
  case 0xe31d:
    pDVar12 = insn_info + 0xf2;
    break;
  case 0xe31e:
    pDVar12 = insn_info + 0x193;
    break;
  case 0xe31f:
    pDVar12 = insn_info + 0x192;
    break;
  case 0xe320:
    pDVar12 = insn_info + 0x65;
    break;
  case 0xe321:
    pDVar12 = insn_info + 0x89;
    break;
  case 0xe324:
    pDVar12 = insn_info + 0x226;
    break;
  case 0xe326:
    pDVar12 = insn_info + 0xc5;
    break;
  case 0xe32a:
    pDVar12 = insn_info + 0x140;
    break;
  case 0xe32f:
    pDVar12 = insn_info + 0x23d;
    break;
  case 0xe330:
    pDVar12 = insn_info + 0x66;
    break;
  case 0xe331:
    pDVar12 = insn_info + 0x8a;
    break;
  case 0xe332:
    pDVar12 = insn_info + 0x139;
    break;
  case 0xe334:
    pDVar12 = insn_info + 0x78;
    break;
  case 0xe336:
    pDVar12 = insn_info + 0x1f6;
    break;
  case 0xe33a:
    pDVar12 = insn_info + 0x141;
    break;
  case 0xe33e:
    pDVar12 = insn_info + 0x23c;
    break;
  case 0xe33f:
    pDVar12 = insn_info + 0x23b;
    break;
  case 0xe346:
    pDVar12 = insn_info + 0x4f;
    break;
  case 0xe350:
    pDVar12 = insn_info + 0x225;
    break;
  case 0xe351:
    pDVar12 = insn_info + 0x1d4;
    break;
  case 0xe354:
    pDVar12 = insn_info + 0x35;
    break;
  case 0xe355:
    pDVar12 = insn_info + 0x86;
    break;
  case 0xe356:
    pDVar12 = insn_info + 0x1e6;
    break;
  case 0xe357:
    pDVar12 = insn_info + 0xf6;
    break;
  case 0xe358:
    pDVar12 = insn_info + 0x115;
    break;
  case 0xe359:
    pDVar12 = insn_info + 0x62;
    break;
  case 0xe35a:
    pDVar12 = insn_info + 3;
    break;
  case 0xe35b:
    pDVar12 = insn_info + 0x24d;
    break;
  case 0xe35c:
    pDVar12 = insn_info + 0x1c0;
    break;
  case 0xe35e:
    pDVar12 = insn_info + 0x1e;
    break;
  case 0xe35f:
    pDVar12 = insn_info + 0x25f;
    break;
  case 0xe370:
    pDVar12 = insn_info + 0x234;
    break;
  case 0xe371:
    pDVar12 = insn_info + 0x126;
    break;
  case 0xe372:
    pDVar12 = insn_info + 0x22e;
    break;
  case 0xe373:
    pDVar12 = insn_info + 0x108;
    break;
  case 0xe375:
    pDVar12 = insn_info + 0x128;
    break;
  case 0xe376:
    pDVar12 = insn_info + 0x144;
    break;
  case 0xe377:
    pDVar12 = insn_info + 0x145;
    break;
  case 0xe378:
    pDVar12 = insn_info + 0x152;
    break;
  case 0xe379:
    pDVar12 = insn_info + 0x77;
    break;
  case 0xe37a:
    pDVar12 = insn_info + 0x18;
    break;
  case 0xe37b:
    pDVar12 = insn_info + 0x259;
    break;
  case 0xe37c:
    pDVar12 = insn_info + 0x1cb;
    break;
  case 0xe380:
    pDVar12 = insn_info + 0x38;
    break;
  case 0xe381:
    pDVar12 = insn_info + 0x1e9;
    break;
  case 0xe382:
    pDVar12 = insn_info + 0xf9;
    break;
  case 0xe385:
    pDVar12 = insn_info + 0x13e;
    break;
  case 0xe386:
    pDVar12 = insn_info + 0x1d1;
    break;
  case 0xe387:
    pDVar12 = insn_info + 0xee;
    break;
  case 0xe388:
    pDVar12 = insn_info + 0x31;
    break;
  case 0xe389:
    pDVar12 = insn_info + 0x26c;
    break;
  case 0xe38e:
    pDVar12 = insn_info + 0x249;
    break;
  case 0xe38f:
    pDVar12 = insn_info + 0x188;
    break;
  case 0xe390:
    pDVar12 = insn_info + 0x162;
    break;
  case 0xe391:
    pDVar12 = insn_info + 0x167;
    break;
  case 0xe394:
    pDVar12 = insn_info + 0x161;
    break;
  case 0xe395:
    pDVar12 = insn_info + 0x166;
    break;
  case 0xe396:
    pDVar12 = insn_info + 0x1cf;
    break;
  case 0xe397:
    pDVar12 = insn_info + 0xec;
    break;
  case 0xe398:
    pDVar12 = insn_info + 0x30;
    break;
  case 0xe399:
    pDVar12 = insn_info + 0x26b;
    break;
  case 0xe39c:
    pDVar12 = insn_info + 0x173;
    break;
  case 0xe39d:
    pDVar12 = insn_info + 0x15d;
    break;
  case 0xe39f:
    pDVar12 = insn_info + 0x13d;
    break;
  case 0xe3c0:
    pDVar12 = insn_info + 0x146;
    break;
  case 0xe3c2:
    pDVar12 = insn_info + 0x163;
    break;
  case 0xe3c3:
    pDVar12 = insn_info + 0x22f;
    break;
  case 0xe3c4:
    pDVar12 = insn_info + 0x154;
    break;
  case 0xe3c6:
    pDVar12 = insn_info + 0x168;
    break;
  case 0xe3c7:
    pDVar12 = insn_info + 0x235;
    break;
  case 0xe3c8:
    pDVar12 = insn_info + 0x15a;
    break;
  case 0xe3ca:
    pDVar12 = insn_info + 0x159;
    break;
  case 0xe3cb:
    pDVar12 = insn_info + 0x237;
    break;
  case 0xe3cd:
    pDVar12 = insn_info + 0x82;
    break;
  case 0xe3cf:
    pDVar12 = insn_info + 0x8e;
    break;
  case 0xe3d0:
    pDVar12 = insn_info + 0x361;
    break;
  case 0xe3d4:
    pDVar12 = insn_info + 0x362;
    break;
  case 0xe3eb:
    pDVar12 = insn_info + 0x13f;
    break;
  default:
    if (uVar6 != 0xe501) goto switchD_00cba6cf_caseD_b90e;
    pDVar12 = insn_info + 0x34a;
  }
LAB_00cbaf11:
  s->insn = pDVar12;
  bVar14 = pDVar12->field_0x4;
  uVar6 = 0;
  lVar23 = 0;
  do {
    DVar1 = format_info[bVar14].op[lVar23];
    uVar19 = (uint)DVar1 >> 8 & 0xff;
    if (uVar19 != 0) {
      uVar22 = (uVar21 << (DVar1._0_1_ & 0x3f)) >> (-DVar1._1_1_ & 0x3fU);
      uVar20 = (uint)uVar22;
      switch((uint)DVar1 >> 0x10 & 3) {
      case 1:
        if (0x20 < uVar19) {
          __assert_fail("f->size <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                        ,0x1956,"void extract_field(DisasFields *, const DisasField *, uint64_t)");
        }
        bVar16 = DVar1._1_1_ - 1;
        uVar20 = (uVar20 ^ 1 << (bVar16 & 0x1f)) - (1 << (bVar16 & 0x1f));
        break;
      case 2:
        uVar20 = uVar20 >> 8 | (int)(char)uVar22 << 0xc;
        break;
      case 3:
        if (uVar19 != 4) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                     ,0x195e,"f->size == 4");
        }
        switch(((uint)DVar1 & 0xff) << 0x1e | ((uint)DVar1 & 0xff) - 8 >> 2) {
        case 0:
          uVar20 = uVar20 | (uint)(uVar21 >> 0x17) & 0x10;
          break;
        case 1:
          uVar20 = uVar20 | (uint)(uVar21 >> 0x16) & 0x10;
          break;
        case 2:
          uVar20 = uVar20 | (uint)(uVar21 >> 0x15) & 0x10;
          break;
        case 6:
          uVar20 = uVar20 | (uint)(uVar21 >> 0x14) & 0x10;
        }
      }
      uVar19 = *(uint *)&(s->fields).field_0x8;
      uVar17 = uVar19 >> 0x10;
      uVar13 = (uint)DVar1 >> 0x12 & 0x3f;
      if ((uVar17 >> ((uint)DVar1 >> 0x12 & 0x1f) & 1) != 0) {
        __assert_fail("((o->presentC >> f->indexC) & 1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                      ,0x1977,"void extract_field(DisasFields *, const DisasField *, uint64_t)");
      }
      *(uint *)&(s->fields).field_0x8 =
           uVar19 & 0xffff | (uVar17 | 1 << ((byte)uVar13 & 0x1f)) << 0x10;
      uVar6 = uVar6 | 1 << ((uint)DVar1 >> 0x18 & 0x1f);
      (s->fields).presentO = uVar6;
      (s->fields).c[uVar13] = uVar20;
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 7);
  a3 = (TCGArg)s->ilen;
LAB_00cbb075:
  tcg_gen_op3_s390x(tcg_ctx,INDEX_op_insn_start,a1,(ulong)s->cc_op,a3);
  val = s->uc;
  plVar8 = val->hook[2].head;
  if (plVar8 != (list_item *)0x0) {
    uVar22 = (s->base).pc_next;
LAB_00cbb0af:
    pvVar2 = plVar8->data;
    if ((*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
         (*(ulong *)((long)pvVar2 + 0x20) < uVar22 || uVar22 < *(ulong *)((long)pvVar2 + 0x18))) ||
       (*(char *)((long)pvVar2 + 0x14) == '\x01')) goto LAB_00cbb0e0;
    pTVar11 = tcg_const_i32_s390x(tcg_ctx,s->ilen);
    pTVar10 = tcg_const_i64_s390x(tcg_ctx,(int64_t)val);
    pTVar9 = tcg_const_i64_s390x(tcg_ctx,uVar22);
    ts_01 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
    ts_00 = (TCGTemp *)(pTVar9 + (long)tcg_ctx);
    ts = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
    local_60 = (TCGTemp *)0x0;
    local_78 = ts_01;
    local_70 = ts_00;
    local_68 = ts;
    if (val->hooks_count[2] == 1) {
      for (plVar8 = val->hook[2].head; plVar8 != (list_item *)0x0; plVar8 = plVar8->next) {
        phVar3 = (hook *)plVar8->data;
        if (phVar3->to_delete == false) {
          pTVar10 = tcg_const_i64_s390x(tcg_ctx,(int64_t)phVar3->user_data);
          local_60 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
          (*val->add_inline_hook)(val,phVar3,&local_78,4);
          tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
        }
      }
    }
    else {
      pTVar11 = tcg_const_i32_s390x(tcg_ctx,2);
      local_58 = ts;
      local_50 = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
      local_48 = ts_01;
      local_40 = ts_00;
      tcg_gen_callN_s390x(tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar11 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_s390x(tcg_ctx,ts_00);
    tcg_temp_free_internal_s390x(tcg_ctx,ts_01);
    tcg_temp_free_internal_s390x(tcg_ctx,ts);
    check_exit_request_s390x(tcg_ctx);
  }
LAB_00cbb239:
  if (pDVar12 == (DisasInsn *)0x0) {
    iVar18 = 1;
    goto LAB_00cbb3f1;
  }
  if ((int)((s->base).tb)->flags < 0) {
    pTVar10 = tcg_const_i64_s390x(tcg_ctx,(s->base).pc_next);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_per_ifetch,(TCGTemp *)0x0,2,&local_58);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
  }
  uVar22 = *(ulong *)pDVar12;
  uVar6 = (uint)uVar22;
  if (0xffff < uVar6) {
    uVar19 = ((s->base).tb)->flags;
    if ((uVar6 >> 0x15 & 1) != 0 && (uVar19 >> 0x11 & 1) != 0) {
      gen_program_exception(s,2);
      return DISAS_NORETURN;
    }
    if ((uVar19 >> 0x1e & 1) == 0) {
      if ((uVar6 >> 0x10 & 1) == 0) {
        bVar14 = 0;
      }
      else {
        if (((s->fields).presentO & 1) == 0) goto LAB_00cbe473;
        iVar18 = (s->fields).c[0];
        bVar14 = 6 < iVar18 | (byte)iVar18 & 1;
      }
      if ((uVar6 >> 0x11 & 1) != 0) {
        if (((s->fields).presentO & 2) == 0) goto LAB_00cbe473;
        uVar20 = (s->fields).c[1];
        if ((uVar20 & 1) != 0) {
          bVar14 = 1;
        }
        if (6 < (int)uVar20) {
          bVar14 = 1;
        }
      }
      if ((uVar6 >> 0x12 & 1) != 0) {
        if (((s->fields).presentO & 4) == 0) goto LAB_00cbe473;
        uVar20 = (s->fields).c[2];
        if ((uVar20 & 1) != 0) {
          bVar14 = 1;
        }
        if (6 < (int)uVar20) {
          bVar14 = 1;
        }
      }
      if ((uVar6 >> 0x13 & 1) != 0) {
        bVar14 = 2;
      }
      bVar16 = 3;
      if ((uVar6 >> 0x14 & 1) == 0) {
        bVar16 = bVar14;
      }
      uVar21 = uVar22 & 0x400000;
      bVar14 = 0xfe;
      if (uVar21 == 0) {
        bVar14 = bVar16;
      }
      if (bVar14 != 0) {
        pTVar11 = tcg_const_i32_s390x(tcg_ctx,(uint)bVar14);
        pTVar4 = tcg_ctx->cpu_env;
        goto LAB_00cbb670;
      }
    }
    else {
      uVar21 = (ulong)(uVar6 & 0x400000);
    }
    if (((byte)(uVar19 >> 0x1d) & 1) == 0 && uVar21 != 0) {
      pTVar11 = tcg_const_i32_s390x(tcg_ctx,0xfe);
      pTVar4 = tcg_ctx->cpu_env;
LAB_00cbb670:
      local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      local_50 = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_data_exception,(TCGTemp *)0x0,2,&local_58);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar11 + (long)tcg_ctx));
      return DISAS_NORETURN;
    }
  }
  if ((char)(uVar22 >> 0x30) != '\0') {
    if ((uVar22 >> 0x30 & 1) != 0) {
      if (((s->fields).presentO & 1) == 0) goto LAB_00cbe473;
      if (((s->fields).c[0] & 1) == 0) goto LAB_00cbb2d3;
LAB_00cbb3e9:
      iVar18 = 6;
LAB_00cbb3f1:
      gen_program_exception(s,iVar18);
      return DISAS_NORETURN;
    }
LAB_00cbb2d3:
    if ((uVar22 >> 0x31 & 1) != 0) {
      if (((s->fields).presentO & 2) == 0) goto LAB_00cbe473;
      if (((s->fields).c[1] & 1) != 0) goto LAB_00cbb3e9;
    }
    if ((uVar22 >> 0x32 & 1) != 0) {
      if (((s->fields).presentO & 4) == 0) goto LAB_00cbe473;
      if (((s->fields).c[2] & 1) != 0) goto LAB_00cbb3e9;
    }
    if ((uVar22 >> 0x33 & 1) != 0) {
      if (((s->fields).presentO & 1) == 0) goto LAB_00cbe473;
      if (((s->fields).c[0] & 2) != 0) goto LAB_00cbb3e9;
    }
    if ((uVar22 >> 0x34 & 1) != 0) {
      if (((s->fields).presentO & 2) == 0) {
LAB_00cbe473:
        __assert_fail("have_field1(s, o)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                      ,0x44d,
                      "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
                     );
      }
      if (((s->fields).c[1] & 2) != 0) goto LAB_00cbb3e9;
    }
  }
  if (pDVar12->help_in1 != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar12->help_in1)(s,&local_a8);
  }
  if (pDVar12->help_in2 != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar12->help_in2)(s,&local_a8);
  }
  if (pDVar12->help_prep != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar12->help_prep)(s,&local_a8);
  }
  if (pDVar12->help_op == (_func_DisasJumpType_DisasContext_ptr_DisasOps_ptr *)0x0) {
    DVar7 = DISAS_NEXT;
  }
  else {
    DVar7 = (*pDVar12->help_op)(s,&local_a8);
    DVar15 = DISAS_NORETURN;
    if (DVar7 == DISAS_NORETURN) goto LAB_00cbb455;
  }
  if (pDVar12->help_wout != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar12->help_wout)(s,&local_a8);
  }
  DVar15 = DVar7;
  if (pDVar12->help_cout != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar12->help_cout)(s,&local_a8);
  }
LAB_00cbb455:
  if ((local_a8.out != (TCGv_i64)0x0) && (local_a8.g_out == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)local_a8.out))
    ;
  }
  if ((local_a8.out2 != (TCGv_i64)0x0) && (local_a8.g_out2 == false)) {
    tcg_temp_free_internal_s390x
              (tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)local_a8.out2));
  }
  if ((local_a8.in1 != (TCGv_i64)0x0) && (local_a8.g_in1 == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)local_a8.in1))
    ;
  }
  if ((local_a8.in2 != (TCGv_i64)0x0) && (local_a8.g_in2 == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)local_a8.in2))
    ;
  }
  if (local_a8.addr1 != (TCGv_i64)0x0) {
    tcg_temp_free_internal_s390x
              (tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)local_a8.addr1));
  }
  if ((int)((s->base).tb)->flags < 0) {
    if ((DVar15 == DISAS_TARGET_3) || (DVar15 == DISAS_NEXT)) {
      tcg_gen_op2_s390x(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->psw_addr + (long)tcg_ctx),
                        s->pc_tmp);
    }
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_per_check_exception,(TCGTemp *)0x0,1,&local_58);
  }
  (s->base).pc_next = s->pc_tmp;
  return DVar15;
LAB_00cbb0e0:
  plVar8 = plVar8->next;
  if (plVar8 == (list_item *)0x0) goto LAB_00cbb239;
  goto LAB_00cbb0af;
}

Assistant:

static DisasJumpType translate_one(CPUS390XState *env, DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const DisasInsn *insn;
    DisasJumpType ret = DISAS_NEXT;
    DisasOps o = { 0 };

    /* Search for the insn in the table.  */
    insn = extract_insn(env, s);

    /* Emit insn_start now that we know the ILEN.  */
    tcg_gen_insn_start(tcg_ctx, s->base.pc_next, s->cc_op, s->ilen);

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(s->uc, UC_HOOK_CODE, s->base.pc_next)) {
        gen_uc_tracecode(tcg_ctx, s->ilen, UC_HOOK_CODE_IDX, s->uc, s->base.pc_next);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    /* Not found means unimplemented/illegal opcode.  */
    if (insn == NULL) {
        // qemu_log_mask(LOG_UNIMP, "unimplemented opcode 0x%02x%02x\n",
        //               s->fields.op, s->fields.op2);
        gen_illegal_opcode(s);
        return DISAS_NORETURN;
    }

    if (s->base.tb->flags & FLAG_MASK_PER) {
        TCGv_i64 addr = tcg_const_i64(tcg_ctx, s->base.pc_next);
        gen_helper_per_ifetch(tcg_ctx, tcg_ctx->cpu_env, addr);
        tcg_temp_free_i64(tcg_ctx, addr);
    }

    /* process flags */
    if (insn->flags) {
        /* privileged instruction */
        if ((s->base.tb->flags & FLAG_MASK_PSTATE) && (insn->flags & IF_PRIV)) {
            gen_program_exception(s, PGM_PRIVILEGED);
            return DISAS_NORETURN;
        }

        /* if AFP is not enabled, instructions and registers are forbidden */
        if (!(s->base.tb->flags & FLAG_MASK_AFP)) {
            uint8_t dxc = 0;

            if ((insn->flags & IF_AFP1) && is_afp_reg(get_field(s, r1))) {
                dxc = 1;
            }
            if ((insn->flags & IF_AFP2) && is_afp_reg(get_field(s, r2))) {
                dxc = 1;
            }
            if ((insn->flags & IF_AFP3) && is_afp_reg(get_field(s, r3))) {
                dxc = 1;
            }
            if (insn->flags & IF_BFP) {
                dxc = 2;
            }
            if (insn->flags & IF_DFP) {
                dxc = 3;
            }
            if (insn->flags & IF_VEC) {
                dxc = 0xfe;
            }
            if (dxc) {
                gen_data_exception(tcg_ctx, dxc);
                return DISAS_NORETURN;
            }
        }

        /* if vector instructions not enabled, executing them is forbidden */
        if (insn->flags & IF_VEC) {
            if (!((s->base.tb->flags & FLAG_MASK_VECTOR))) {
                gen_data_exception(tcg_ctx, 0xfe);
                return DISAS_NORETURN;
            }
        }
    }

    /* Check for insn specification exceptions.  */
    if (insn->spec) {
        if ((insn->spec & SPEC_r1_even && get_field(s, r1) & 1) ||
            (insn->spec & SPEC_r2_even && get_field(s, r2) & 1) ||
            (insn->spec & SPEC_r3_even && get_field(s, r3) & 1) ||
            (insn->spec & SPEC_r1_f128 && !is_fp_pair(get_field(s, r1))) ||
            (insn->spec & SPEC_r2_f128 && !is_fp_pair(get_field(s, r2)))) {
            gen_program_exception(s, PGM_SPECIFICATION);
            return DISAS_NORETURN;
        }
    }

    /* Implement the instruction.  */
    if (insn->help_in1) {
        insn->help_in1(s, &o);
    }
    if (insn->help_in2) {
        insn->help_in2(s, &o);
    }
    if (insn->help_prep) {
        insn->help_prep(s, &o);
    }
    if (insn->help_op) {
        ret = insn->help_op(s, &o);
    }
    if (ret != DISAS_NORETURN) {
        if (insn->help_wout) {
            insn->help_wout(s, &o);
        }
        if (insn->help_cout) {
            insn->help_cout(s, &o);
        }
    }

    /* Free any temporaries created by the helpers.  */
    if (o.out && !o.g_out) {
        tcg_temp_free_i64(tcg_ctx, o.out);
    }
    if (o.out2 && !o.g_out2) {
        tcg_temp_free_i64(tcg_ctx, o.out2);
    }
    if (o.in1 && !o.g_in1) {
        tcg_temp_free_i64(tcg_ctx, o.in1);
    }
    if (o.in2 && !o.g_in2) {
        tcg_temp_free_i64(tcg_ctx, o.in2);
    }
    if (o.addr1) {
        tcg_temp_free_i64(tcg_ctx, o.addr1);
    }

    if (s->base.tb->flags & FLAG_MASK_PER) {
        /* An exception might be triggered, save PSW if not already done.  */
        if (ret == DISAS_NEXT || ret == DISAS_PC_STALE) {
            tcg_gen_movi_i64(tcg_ctx, tcg_ctx->psw_addr, s->pc_tmp);
        }

        /* Call the helper to check for a possible PER exception.  */
        gen_helper_per_check_exception(tcg_ctx, tcg_ctx->cpu_env);
    }

    /* Advance to the next instruction.  */
    s->base.pc_next = s->pc_tmp;
    return ret;
}